

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  undefined8 uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  int iVar42;
  undefined4 uVar43;
  ulong uVar44;
  undefined4 uVar48;
  ulong extraout_RAX;
  RayHitK<4> *pRVar45;
  ulong extraout_RAX_00;
  RTCFilterFunctionN p_Var46;
  undefined1 (*pauVar47) [16];
  int iVar49;
  ulong uVar50;
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  short sVar60;
  float fVar61;
  float fVar62;
  float fVar99;
  float fVar101;
  __m128 a_2;
  undefined2 uVar98;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  float fVar100;
  float fVar102;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float pp;
  float fVar103;
  float fVar137;
  float fVar138;
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar154;
  float fVar155;
  vfloat4 a;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar168;
  float fVar169;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar180;
  float fVar181;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar208;
  float fVar209;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar228;
  float fVar229;
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar236;
  float fVar237;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar243;
  float fVar244;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar245;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  float fVar253;
  float fVar260;
  float fVar262;
  undefined1 auVar254 [16];
  float fVar264;
  undefined1 auVar257 [16];
  float fVar261;
  float fVar263;
  float fVar265;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar266;
  float fVar270;
  float fVar271;
  __m128 a_1;
  float fVar272;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_688 [8];
  float fStack_680;
  float fStack_67c;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  undefined8 local_608;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined8 local_5c8;
  uint uStack_5c0;
  uint uStack_5bc;
  undefined1 local_5b8 [16];
  ulong local_5a0;
  undefined1 local_598 [4];
  float fStack_594;
  undefined8 uStack_590;
  RTCRayQueryContext *local_588;
  RayHitK<4> *local_580;
  RTCHitN *local_578;
  uint local_570;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  undefined4 uStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 (*local_488) [16];
  Primitive *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 uVar97;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  
  PVar7 = prim[1];
  uVar52 = (ulong)(byte)PVar7;
  pPVar5 = prim + uVar52 * 0x19 + 6;
  fVar155 = *(float *)(pPVar5 + 0xc);
  fVar170 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar155;
  fVar180 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar155;
  fVar181 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar155;
  fVar139 = *(float *)(ray + k * 4 + 0x40) * fVar155;
  fVar154 = *(float *)(ray + k * 4 + 0x50) * fVar155;
  fVar155 = *(float *)(ray + k * 4 + 0x60) * fVar155;
  uVar48 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar53;
  auVar70._12_2_ = uVar98;
  auVar70._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar185._12_4_ = auVar70._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar53;
  auVar185._10_2_ = uVar98;
  auVar186._10_6_ = auVar185._10_6_;
  auVar186._8_2_ = uVar98;
  auVar186._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar27._4_8_ = auVar186._8_8_;
  auVar27._2_2_ = uVar98;
  auVar27._0_2_ = uVar98;
  fVar103 = (float)((int)sVar60 >> 8);
  fVar137 = (float)(auVar27._0_4_ >> 0x18);
  fVar138 = (float)(auVar186._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar53;
  auVar205._12_2_ = uVar98;
  auVar205._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar226._12_4_ = auVar205._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar53;
  auVar226._10_2_ = uVar98;
  auVar63._10_6_ = auVar226._10_6_;
  auVar63._8_2_ = uVar98;
  auVar63._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar28._4_8_ = auVar63._8_8_;
  auVar28._2_2_ = uVar98;
  auVar28._0_2_ = uVar98;
  fVar182 = (float)((int)sVar60 >> 8);
  fVar196 = (float)(auVar28._0_4_ >> 0x18);
  fVar197 = (float)(auVar63._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar53;
  auVar66._12_2_ = uVar98;
  auVar66._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar53;
  auVar65._10_2_ = uVar98;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar98;
  auVar64._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar29._4_8_ = auVar64._8_8_;
  auVar29._2_2_ = uVar98;
  auVar29._0_2_ = uVar98;
  fVar156 = (float)((int)sVar60 >> 8);
  fVar168 = (float)(auVar29._0_4_ >> 0x18);
  fVar169 = (float)(auVar64._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar52 * 0xb + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar53;
  auVar69._12_2_ = uVar98;
  auVar69._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar53;
  auVar68._10_2_ = uVar98;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar98;
  auVar67._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar30._4_8_ = auVar67._8_8_;
  auVar30._2_2_ = uVar98;
  auVar30._0_2_ = uVar98;
  fVar61 = (float)((int)sVar60 >> 8);
  fVar99 = (float)(auVar30._0_4_ >> 0x18);
  fVar101 = (float)(auVar67._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar53;
  auVar201._12_2_ = uVar98;
  auVar201._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar53;
  auVar200._10_2_ = uVar98;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar98;
  auVar199._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar31._4_8_ = auVar199._8_8_;
  auVar31._2_2_ = uVar98;
  auVar31._0_2_ = uVar98;
  fVar198 = (float)((int)sVar60 >> 8);
  fVar208 = (float)(auVar31._0_4_ >> 0x18);
  fVar209 = (float)(auVar199._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + (uint)(byte)PVar7 * 0xc + uVar52 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar53;
  auVar213._12_2_ = uVar98;
  auVar213._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar53;
  auVar212._10_2_ = uVar98;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar98;
  auVar211._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar32._4_8_ = auVar211._8_8_;
  auVar32._2_2_ = uVar98;
  auVar32._0_2_ = uVar98;
  fVar238 = (float)((int)sVar60 >> 8);
  fVar243 = (float)(auVar32._0_4_ >> 0x18);
  fVar244 = (float)(auVar211._8_4_ >> 0x18);
  uVar44 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  uVar48 = *(undefined4 *)(prim + uVar44 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar53;
  auVar216._12_2_ = uVar98;
  auVar216._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar53;
  auVar215._10_2_ = uVar98;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar98;
  auVar214._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar33._4_8_ = auVar214._8_8_;
  auVar33._2_2_ = uVar98;
  auVar33._0_2_ = uVar98;
  fVar230 = (float)((int)sVar60 >> 8);
  fVar236 = (float)(auVar33._0_4_ >> 0x18);
  fVar237 = (float)(auVar214._8_4_ >> 0x18);
  uVar48 = *(undefined4 *)(prim + uVar44 + uVar52 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar53;
  auVar219._12_2_ = uVar98;
  auVar219._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar53;
  auVar218._10_2_ = uVar98;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar98;
  auVar217._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar34._4_8_ = auVar217._8_8_;
  auVar34._2_2_ = uVar98;
  auVar34._0_2_ = uVar98;
  fVar245 = (float)((int)sVar60 >> 8);
  fVar249 = (float)(auVar34._0_4_ >> 0x18);
  fVar250 = (float)(auVar217._8_4_ >> 0x18);
  uVar50 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar48 = *(undefined4 *)(prim + uVar50 + 6);
  uVar97 = (undefined1)((uint)uVar48 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar48 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar48));
  uVar97 = (undefined1)((uint)uVar48 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar97),uVar97);
  sVar60 = CONCAT11((char)uVar48,(char)uVar48);
  uVar53 = CONCAT62(uVar26,sVar60);
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar53;
  auVar256._12_2_ = uVar98;
  auVar256._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar53;
  auVar255._10_2_ = uVar98;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar98;
  auVar254._0_8_ = uVar53;
  uVar98 = (undefined2)uVar26;
  auVar35._4_8_ = auVar254._8_8_;
  auVar35._2_2_ = uVar98;
  auVar35._0_2_ = uVar98;
  fVar62 = (float)((int)sVar60 >> 8);
  fVar100 = (float)(auVar35._0_4_ >> 0x18);
  fVar102 = (float)(auVar254._8_4_ >> 0x18);
  fVar266 = fVar139 * fVar103 + fVar154 * fVar182 + fVar155 * fVar156;
  fVar270 = fVar139 * fVar137 + fVar154 * fVar196 + fVar155 * fVar168;
  fVar271 = fVar139 * fVar138 + fVar154 * fVar197 + fVar155 * fVar169;
  fVar272 = fVar139 * (float)(auVar185._12_4_ >> 0x18) +
            fVar154 * (float)(auVar226._12_4_ >> 0x18) + fVar155 * (float)(auVar65._12_4_ >> 0x18);
  fVar252 = fVar139 * fVar61 + fVar154 * fVar198 + fVar155 * fVar238;
  fVar260 = fVar139 * fVar99 + fVar154 * fVar208 + fVar155 * fVar243;
  fVar262 = fVar139 * fVar101 + fVar154 * fVar209 + fVar155 * fVar244;
  fVar264 = fVar139 * (float)(auVar68._12_4_ >> 0x18) +
            fVar154 * (float)(auVar200._12_4_ >> 0x18) + fVar155 * (float)(auVar212._12_4_ >> 0x18);
  fVar210 = fVar139 * fVar230 + fVar154 * fVar245 + fVar155 * fVar62;
  fVar228 = fVar139 * fVar236 + fVar154 * fVar249 + fVar155 * fVar100;
  fVar229 = fVar139 * fVar237 + fVar154 * fVar250 + fVar155 * fVar102;
  fVar139 = fVar139 * (float)(auVar215._12_4_ >> 0x18) +
            fVar154 * (float)(auVar218._12_4_ >> 0x18) + fVar155 * (float)(auVar255._12_4_ >> 0x18);
  uVar48 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar156 = fVar103 * fVar170 + fVar182 * fVar180 + fVar156 * fVar181;
  fVar168 = fVar137 * fVar170 + fVar196 * fVar180 + fVar168 * fVar181;
  fVar169 = fVar138 * fVar170 + fVar197 * fVar180 + fVar169 * fVar181;
  fVar182 = (float)(auVar185._12_4_ >> 0x18) * fVar170 +
            (float)(auVar226._12_4_ >> 0x18) * fVar180 + (float)(auVar65._12_4_ >> 0x18) * fVar181;
  fVar238 = fVar61 * fVar170 + fVar198 * fVar180 + fVar238 * fVar181;
  fVar208 = fVar99 * fVar170 + fVar208 * fVar180 + fVar243 * fVar181;
  fVar209 = fVar101 * fVar170 + fVar209 * fVar180 + fVar244 * fVar181;
  fVar243 = (float)(auVar68._12_4_ >> 0x18) * fVar170 +
            (float)(auVar200._12_4_ >> 0x18) * fVar180 + (float)(auVar212._12_4_ >> 0x18) * fVar181;
  fVar196 = fVar170 * fVar230 + fVar180 * fVar245 + fVar181 * fVar62;
  fVar197 = fVar170 * fVar236 + fVar180 * fVar249 + fVar181 * fVar100;
  fVar198 = fVar170 * fVar237 + fVar180 * fVar250 + fVar181 * fVar102;
  fVar170 = fVar170 * (float)(auVar215._12_4_ >> 0x18) +
            fVar180 * (float)(auVar218._12_4_ >> 0x18) + fVar181 * (float)(auVar255._12_4_ >> 0x18);
  fVar155 = (float)DAT_01f80d30;
  fVar61 = DAT_01f80d30._4_4_;
  fVar62 = DAT_01f80d30._8_4_;
  fVar99 = DAT_01f80d30._12_4_;
  uVar55 = -(uint)(fVar155 <= ABS(fVar266));
  uVar56 = -(uint)(fVar61 <= ABS(fVar270));
  uVar57 = -(uint)(fVar62 <= ABS(fVar271));
  uVar58 = -(uint)(fVar99 <= ABS(fVar272));
  auVar267._0_4_ = (uint)fVar266 & uVar55;
  auVar267._4_4_ = (uint)fVar270 & uVar56;
  auVar267._8_4_ = (uint)fVar271 & uVar57;
  auVar267._12_4_ = (uint)fVar272 & uVar58;
  auVar171._0_4_ = ~uVar55 & (uint)fVar155;
  auVar171._4_4_ = ~uVar56 & (uint)fVar61;
  auVar171._8_4_ = ~uVar57 & (uint)fVar62;
  auVar171._12_4_ = ~uVar58 & (uint)fVar99;
  auVar171 = auVar171 | auVar267;
  uVar55 = -(uint)(fVar155 <= ABS(fVar252));
  uVar56 = -(uint)(fVar61 <= ABS(fVar260));
  uVar57 = -(uint)(fVar62 <= ABS(fVar262));
  uVar58 = -(uint)(fVar99 <= ABS(fVar264));
  auVar257._0_4_ = (uint)fVar252 & uVar55;
  auVar257._4_4_ = (uint)fVar260 & uVar56;
  auVar257._8_4_ = (uint)fVar262 & uVar57;
  auVar257._12_4_ = (uint)fVar264 & uVar58;
  auVar183._0_4_ = ~uVar55 & (uint)fVar155;
  auVar183._4_4_ = ~uVar56 & (uint)fVar61;
  auVar183._8_4_ = ~uVar57 & (uint)fVar62;
  auVar183._12_4_ = ~uVar58 & (uint)fVar99;
  auVar183 = auVar183 | auVar257;
  uVar55 = -(uint)(fVar155 <= ABS(fVar210));
  uVar56 = -(uint)(fVar61 <= ABS(fVar228));
  uVar57 = -(uint)(fVar62 <= ABS(fVar229));
  uVar58 = -(uint)(fVar99 <= ABS(fVar139));
  auVar220._0_4_ = (uint)fVar210 & uVar55;
  auVar220._4_4_ = (uint)fVar228 & uVar56;
  auVar220._8_4_ = (uint)fVar229 & uVar57;
  auVar220._12_4_ = (uint)fVar139 & uVar58;
  auVar202._0_4_ = ~uVar55 & (uint)fVar155;
  auVar202._4_4_ = ~uVar56 & (uint)fVar61;
  auVar202._8_4_ = ~uVar57 & (uint)fVar62;
  auVar202._12_4_ = ~uVar58 & (uint)fVar99;
  auVar202 = auVar202 | auVar220;
  auVar70 = rcpps(_DAT_01f80d30,auVar171);
  fVar155 = auVar70._0_4_;
  fVar99 = auVar70._4_4_;
  fVar102 = auVar70._8_4_;
  fVar138 = auVar70._12_4_;
  fVar155 = (1.0 - auVar171._0_4_ * fVar155) * fVar155 + fVar155;
  fVar99 = (1.0 - auVar171._4_4_ * fVar99) * fVar99 + fVar99;
  fVar102 = (1.0 - auVar171._8_4_ * fVar102) * fVar102 + fVar102;
  fVar138 = (1.0 - auVar171._12_4_ * fVar138) * fVar138 + fVar138;
  auVar70 = rcpps(auVar70,auVar183);
  fVar61 = auVar70._0_4_;
  fVar100 = auVar70._4_4_;
  fVar103 = auVar70._8_4_;
  fVar139 = auVar70._12_4_;
  fVar61 = (1.0 - auVar183._0_4_ * fVar61) * fVar61 + fVar61;
  fVar100 = (1.0 - auVar183._4_4_ * fVar100) * fVar100 + fVar100;
  fVar103 = (1.0 - auVar183._8_4_ * fVar103) * fVar103 + fVar103;
  fVar139 = (1.0 - auVar183._12_4_ * fVar139) * fVar139 + fVar139;
  auVar70 = rcpps(auVar70,auVar202);
  fVar62 = auVar70._0_4_;
  fVar101 = auVar70._4_4_;
  fVar137 = auVar70._8_4_;
  fVar154 = auVar70._12_4_;
  fVar62 = (1.0 - auVar202._0_4_ * fVar62) * fVar62 + fVar62;
  fVar101 = (1.0 - auVar202._4_4_ * fVar101) * fVar101 + fVar101;
  fVar137 = (1.0 - auVar202._8_4_ * fVar137) * fVar137 + fVar137;
  fVar154 = (1.0 - auVar202._12_4_ * fVar154) * fVar154 + fVar154;
  uVar53 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar53;
  auVar73._12_2_ = uVar98;
  auVar73._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar53;
  auVar72._10_2_ = uVar98;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar98;
  auVar71._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar36._4_8_ = auVar71._8_8_;
  auVar36._2_2_ = uVar98;
  auVar36._0_2_ = uVar98;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar168) * fVar99,
                ((float)(int)(short)uVar53 - fVar156) * fVar155);
  auVar172._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar169) * fVar102;
  auVar172._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar182) * fVar138;
  uVar53 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar53;
  auVar76._12_2_ = uVar98;
  auVar76._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar53;
  auVar75._10_2_ = uVar98;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar98;
  auVar74._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar37._4_8_ = auVar74._8_8_;
  auVar37._2_2_ = uVar98;
  auVar37._0_2_ = uVar98;
  auVar203._0_4_ = ((float)(int)(short)uVar53 - fVar156) * fVar155;
  auVar203._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar168) * fVar99;
  auVar203._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar169) * fVar102;
  auVar203._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar182) * fVar138;
  uVar53 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  uVar44 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar52 * -2 + 6);
  uVar98 = (undefined2)(uVar44 >> 0x30);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar44;
  auVar106._12_2_ = uVar98;
  auVar106._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar44 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar44;
  auVar105._10_2_ = uVar98;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar98;
  auVar104._0_8_ = uVar44;
  uVar98 = (undefined2)(uVar44 >> 0x10);
  auVar38._4_8_ = auVar104._8_8_;
  auVar38._2_2_ = uVar98;
  auVar38._0_2_ = uVar98;
  auVar107._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar208) * fVar100,
                ((float)(int)(short)uVar44 - fVar238) * fVar61);
  auVar107._8_4_ = ((float)(auVar104._8_4_ >> 0x10) - fVar209) * fVar103;
  auVar107._12_4_ = ((float)(auVar105._12_4_ >> 0x10) - fVar243) * fVar139;
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar53;
  auVar79._12_2_ = uVar98;
  auVar79._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar53;
  auVar78._10_2_ = uVar98;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar98;
  auVar77._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar39._4_8_ = auVar77._8_8_;
  auVar39._2_2_ = uVar98;
  auVar39._0_2_ = uVar98;
  auVar231._0_4_ = ((float)(int)(short)uVar53 - fVar238) * fVar61;
  auVar231._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar208) * fVar100;
  auVar231._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar209) * fVar103;
  auVar231._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar243) * fVar139;
  uVar53 = *(ulong *)(prim + uVar50 + uVar52 + 6);
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar53;
  auVar82._12_2_ = uVar98;
  auVar82._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar53;
  auVar81._10_2_ = uVar98;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar98;
  auVar80._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar40._4_8_ = auVar80._8_8_;
  auVar40._2_2_ = uVar98;
  auVar40._0_2_ = uVar98;
  auVar83._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar197) * fVar101,
                ((float)(int)(short)uVar53 - fVar196) * fVar62);
  auVar83._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar198) * fVar137;
  auVar83._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar170) * fVar154;
  uVar53 = *(ulong *)(prim + uVar52 * 0x17 + 6);
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar53;
  auVar223._12_2_ = uVar98;
  auVar223._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar53;
  auVar222._10_2_ = uVar98;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar98;
  auVar221._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar41._4_8_ = auVar221._8_8_;
  auVar41._2_2_ = uVar98;
  auVar41._0_2_ = uVar98;
  auVar224._0_4_ = ((float)(int)(short)uVar53 - fVar196) * fVar62;
  auVar224._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar197) * fVar101;
  auVar224._8_4_ = ((float)(auVar221._8_4_ >> 0x10) - fVar198) * fVar137;
  auVar224._12_4_ = ((float)(auVar222._12_4_ >> 0x10) - fVar170) * fVar154;
  auVar184._8_4_ = auVar172._8_4_;
  auVar184._0_8_ = auVar172._0_8_;
  auVar184._12_4_ = auVar172._12_4_;
  auVar185 = minps(auVar184,auVar203);
  auVar140._8_4_ = auVar107._8_4_;
  auVar140._0_8_ = auVar107._0_8_;
  auVar140._12_4_ = auVar107._12_4_;
  auVar70 = minps(auVar140,auVar231);
  auVar185 = maxps(auVar185,auVar70);
  auVar141._8_4_ = auVar83._8_4_;
  auVar141._0_8_ = auVar83._0_8_;
  auVar141._12_4_ = auVar83._12_4_;
  auVar70 = minps(auVar141,auVar224);
  auVar157._4_4_ = uVar48;
  auVar157._0_4_ = uVar48;
  auVar157._8_4_ = uVar48;
  auVar157._12_4_ = uVar48;
  auVar70 = maxps(auVar70,auVar157);
  auVar186 = maxps(auVar185,auVar70);
  auVar185 = maxps(auVar172,auVar203);
  auVar70 = maxps(auVar107,auVar231);
  auVar185 = minps(auVar185,auVar70);
  local_2c8 = auVar186._0_4_ * 0.99999964;
  fStack_2c4 = auVar186._4_4_ * 0.99999964;
  fStack_2c0 = auVar186._8_4_ * 0.99999964;
  fStack_2bc = auVar186._12_4_ * 0.99999964;
  auVar70 = maxps(auVar83,auVar224);
  uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar108._4_4_ = uVar48;
  auVar108._0_4_ = uVar48;
  auVar108._8_4_ = uVar48;
  auVar108._12_4_ = uVar48;
  auVar70 = minps(auVar70,auVar108);
  auVar70 = minps(auVar185,auVar70);
  auVar109._0_4_ = -(uint)(PVar7 != (Primitive)0x0 && local_2c8 <= auVar70._0_4_ * 1.0000004);
  auVar109._4_4_ = -(uint)(1 < (byte)PVar7 && fStack_2c4 <= auVar70._4_4_ * 1.0000004);
  auVar109._8_4_ = -(uint)(2 < (byte)PVar7 && fStack_2c0 <= auVar70._8_4_ * 1.0000004);
  auVar109._12_4_ = -(uint)(3 < (byte)PVar7 && fStack_2bc <= auVar70._12_4_ * 1.0000004);
  uVar55 = movmskps((uint)(byte)PVar7,auVar109);
  if (uVar55 == 0) {
    return;
  }
  uVar55 = uVar55 & 0xff;
  local_208._0_12_ = mm_lookupmask_ps._240_12_;
  local_208._12_4_ = 0;
  local_488 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_480 = prim;
LAB_00a9ba03:
  uVar53 = (ulong)uVar55;
  lVar54 = 0;
  if (uVar53 != 0) {
    for (; (uVar55 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  uVar53 = uVar53 - 1 & uVar53;
  uVar55 = *(uint *)(prim + 2);
  local_3b8 = *(uint *)(prim + lVar54 * 4 + 6);
  local_5a0 = (ulong)local_3b8;
  pGVar8 = (context->scene->geometries).items[uVar55].ptr;
  uVar44 = *(ulong *)&pGVar8->field_0x58;
  _Var9 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar52 = (ulong)*(uint *)(uVar44 + _Var9 * local_5a0);
  p_Var46 = pGVar8[1].intersectionFilterN;
  lVar54 = 0;
  if (uVar53 != 0) {
    for (; (uVar53 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  lVar54 = *(long *)&pGVar8[1].time_range.upper;
  pfVar1 = (float *)(lVar54 + (long)p_Var46 * uVar52);
  pfVar2 = (float *)(lVar54 + (uVar52 + 1) * (long)p_Var46);
  pfVar3 = (float *)(lVar54 + (uVar52 + 2) * (long)p_Var46);
  pfVar4 = (float *)(lVar54 + (uVar52 + 3) * (long)p_Var46);
  if ((uVar53 != 0) && (uVar52 = uVar53 - 1 & uVar53, uVar52 != 0)) {
    lVar54 = 0;
    if (uVar52 != 0) {
      for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
      }
    }
    uVar44 = (ulong)*(uint *)(uVar44 + _Var9 * *(uint *)(prim + lVar54 * 4 + 6));
  }
  fStack_13c = *(float *)(ray + k * 4 + 0x40);
  local_628._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
  fVar61 = *(float *)(ray + k * 4 + 0x60);
  fVar155 = (float)local_628._4_4_ * (float)local_628._4_4_;
  fVar99 = fVar61 * fVar61;
  fVar62 = fVar155 + fStack_13c * fStack_13c + fVar99;
  auVar110._0_8_ = CONCAT44(fVar155 + fVar155 + 0.0,fVar62);
  auVar110._8_4_ = fVar155 + fVar99 + fVar99;
  auVar110._12_4_ = fVar155 + 0.0 + 0.0;
  auVar187._8_4_ = auVar110._8_4_;
  auVar187._0_8_ = auVar110._0_8_;
  auVar187._12_4_ = auVar110._12_4_;
  auVar70 = rcpss(auVar187,auVar110);
  local_558 = (2.0 - auVar70._0_4_ * fVar62) * auVar70._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * fVar61 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * (float)local_628._4_4_ +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - *(float *)(ray + k * 4)) *
              fStack_13c);
  local_528._4_4_ = local_628._4_4_;
  local_528._0_4_ = fStack_13c;
  fStack_520 = fVar61;
  fStack_51c = 0.0;
  fStack_554 = local_558;
  fStack_550 = local_558;
  fStack_54c = local_558;
  local_188 = fStack_13c * local_558 + *(float *)(ray + k * 4);
  local_198 = (float)local_628._4_4_ * local_558 + *(float *)(ray + k * 4 + 0x10);
  local_1a8 = fVar61 * local_558 + *(float *)(ray + k * 4 + 0x20);
  fVar100 = *pfVar1 - local_188;
  fVar101 = pfVar1[1] - local_198;
  fVar102 = pfVar1[2] - local_1a8;
  fVar103 = pfVar1[3] - 0.0;
  local_168 = *pfVar3 - local_188;
  fStack_434 = pfVar3[1] - local_198;
  local_178 = pfVar3[2] - local_1a8;
  fStack_42c = pfVar3[3] - 0.0;
  local_428 = *pfVar2 - local_188;
  fStack_424 = pfVar2[1] - local_198;
  fStack_420 = pfVar2[2] - local_1a8;
  fStack_41c = pfVar2[3] - 0.0;
  local_188 = *pfVar4 - local_188;
  local_198 = pfVar4[1] - local_198;
  local_1a8 = pfVar4[2] - local_1a8;
  fStack_43c = pfVar4[3] - 0.0;
  local_158 = fVar102;
  fStack_154 = fVar102;
  fStack_150 = fVar102;
  fStack_14c = fVar102;
  fVar155 = (float)local_628._4_4_ * (float)local_628._4_4_;
  fStack_13c = fStack_13c * fStack_13c;
  local_148 = fStack_13c + fVar155 + fVar99;
  fStack_144 = fStack_13c + fVar155 + fVar99;
  fStack_140 = fStack_13c + fVar155 + fVar99;
  fStack_13c = fStack_13c + fVar155 + fVar99;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_438 = local_168;
  fStack_430 = local_178;
  local_388 = fStack_42c;
  fStack_384 = fStack_42c;
  fStack_380 = fStack_42c;
  fStack_37c = fStack_42c;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  local_448 = local_188;
  fStack_444 = local_198;
  fStack_440 = local_1a8;
  local_1b8 = fStack_43c;
  fStack_1b4 = fStack_43c;
  fStack_1b0 = fStack_43c;
  fStack_1ac = fStack_43c;
  local_458 = *(float *)(ray + k * 4 + 0x40);
  fStack_454 = local_458;
  fStack_450 = local_458;
  fStack_44c = local_458;
  local_398 = ABS(local_148);
  fStack_394 = ABS(fStack_144);
  fStack_390 = ABS(fStack_140);
  fStack_38c = ABS(fStack_13c);
  fVar155 = *(float *)(ray + k * 4 + 0x30);
  local_3e8 = ZEXT416((uint)local_558);
  local_1f8 = fVar155 - local_558;
  fStack_1f4 = local_1f8;
  fStack_1f0 = local_1f8;
  fStack_1ec = local_1f8;
  local_3a8 = uVar55;
  uStack_3a4 = uVar55;
  uStack_3a0 = uVar55;
  uStack_39c = uVar55;
  uStack_3b4 = local_3b8;
  uStack_3b0 = local_3b8;
  uStack_3ac = local_3b8;
  iVar49 = 1;
  uVar52 = 0;
  local_1e8 = 0.0;
  fStack_1e4 = 1.0;
  local_628._0_4_ = local_628._4_4_;
  fStack_620 = (float)local_628._4_4_;
  fStack_61c = (float)local_628._4_4_;
  local_248 = fVar100;
  fStack_244 = fVar100;
  fStack_240 = fVar100;
  fStack_23c = fVar100;
  local_258 = fVar101;
  fStack_254 = fVar101;
  fStack_250 = fVar101;
  fStack_24c = fVar101;
  local_268 = fVar103;
  fStack_264 = fVar103;
  fStack_260 = fVar103;
  fStack_25c = fVar103;
  local_278 = local_428;
  fStack_274 = local_428;
  fStack_270 = local_428;
  fStack_26c = local_428;
  local_288 = fStack_424;
  fStack_284 = fStack_424;
  fStack_280 = fStack_424;
  fStack_27c = fStack_424;
  local_468 = fStack_420;
  fStack_464 = fStack_420;
  fStack_460 = fStack_420;
  fStack_45c = fStack_420;
  local_478 = fStack_41c;
  fStack_474 = fStack_41c;
  fStack_470 = fStack_41c;
  fStack_46c = fStack_41c;
  local_298 = fStack_434;
  fStack_294 = fStack_434;
  fStack_290 = fStack_434;
  fStack_28c = fStack_434;
  do {
    iVar51 = (int)uVar52;
    fVar180 = fStack_1e4 - local_1e8;
    uStack_1e0 = 0;
    uStack_1dc = 0;
    local_568._4_4_ = local_1e8;
    local_568._0_4_ = local_1e8;
    fStack_560 = local_1e8;
    fStack_55c = local_1e8;
    fVar137 = fVar180 * 0.0 + local_1e8;
    fVar138 = fVar180 * 0.33333334 + local_1e8;
    fVar139 = fVar180 * 0.6666667 + local_1e8;
    fVar154 = fVar180 * 1.0 + local_1e8;
    fVar156 = 1.0 - fVar137;
    fVar168 = 1.0 - fVar138;
    fVar169 = 1.0 - fVar139;
    fVar182 = 1.0 - fVar154;
    fVar245 = local_278 * fVar156 + local_168 * fVar137;
    fVar262 = fStack_274 * fVar168 + fStack_164 * fVar138;
    fVar264 = fStack_270 * fVar169 + fStack_160 * fVar139;
    fVar266 = fStack_26c * fVar182 + fStack_15c * fVar154;
    fVar270 = local_288 * fVar156 + local_298 * fVar137;
    fVar271 = fStack_284 * fVar168 + fStack_294 * fVar138;
    fVar272 = fStack_280 * fVar169 + fStack_290 * fVar139;
    fVar251 = fStack_27c * fVar182 + fStack_28c * fVar154;
    fVar253 = local_468 * fVar156 + local_178 * fVar137;
    fVar261 = fStack_464 * fVar168 + fStack_174 * fVar138;
    fVar263 = fStack_460 * fVar169 + fStack_170 * fVar139;
    fVar265 = fStack_45c * fVar182 + fStack_16c * fVar154;
    fVar99 = local_478 * fVar156 + local_388 * fVar137;
    fVar249 = fStack_474 * fVar168 + fStack_384 * fVar138;
    fVar250 = fStack_470 * fVar169 + fStack_380 * fVar139;
    fVar252 = fStack_46c * fVar182 + fStack_37c * fVar154;
    fVar196 = (local_248 * fVar156 + local_278 * fVar137) * fVar156 + fVar137 * fVar245;
    fVar197 = (fStack_244 * fVar168 + fStack_274 * fVar138) * fVar168 + fVar138 * fVar262;
    fVar198 = (fStack_240 * fVar169 + fStack_270 * fVar139) * fVar169 + fVar139 * fVar264;
    fVar170 = (fStack_23c * fVar182 + fStack_26c * fVar154) * fVar182 + fVar154 * fVar266;
    fVar181 = (local_258 * fVar156 + local_288 * fVar137) * fVar156 + fVar137 * fVar270;
    fVar208 = (fStack_254 * fVar168 + fStack_284 * fVar138) * fVar168 + fVar138 * fVar271;
    fVar209 = (fStack_250 * fVar169 + fStack_280 * fVar139) * fVar169 + fVar139 * fVar272;
    fVar210 = (fStack_24c * fVar182 + fStack_27c * fVar154) * fVar182 + fVar154 * fVar251;
    fVar228 = (local_158 * fVar156 + local_468 * fVar137) * fVar156 + fVar137 * fVar253;
    fVar229 = (fStack_154 * fVar168 + fStack_464 * fVar138) * fVar168 + fVar138 * fVar261;
    fVar230 = (fStack_150 * fVar169 + fStack_460 * fVar139) * fVar169 + fVar139 * fVar263;
    fVar236 = (fStack_14c * fVar182 + fStack_45c * fVar154) * fVar182 + fVar154 * fVar265;
    fVar237 = (local_268 * fVar156 + local_478 * fVar137) * fVar156 + fVar137 * fVar99;
    fVar238 = (fStack_264 * fVar168 + fStack_474 * fVar138) * fVar168 + fVar138 * fVar249;
    fVar243 = (fStack_260 * fVar169 + fStack_470 * fVar139) * fVar169 + fVar139 * fVar250;
    fVar244 = (fStack_25c * fVar182 + fStack_46c * fVar154) * fVar182 + fVar154 * fVar252;
    fVar260 = fVar245 * fVar156 + (local_168 * fVar156 + local_188 * fVar137) * fVar137;
    fVar262 = fVar262 * fVar168 + (fStack_164 * fVar168 + fStack_184 * fVar138) * fVar138;
    fVar264 = fVar264 * fVar169 + (fStack_160 * fVar169 + fStack_180 * fVar139) * fVar139;
    fVar266 = fVar266 * fVar182 + (fStack_15c * fVar182 + fStack_17c * fVar154) * fVar154;
    fVar270 = fVar270 * fVar156 + (local_298 * fVar156 + local_198 * fVar137) * fVar137;
    fVar271 = fVar271 * fVar168 + (fStack_294 * fVar168 + fStack_194 * fVar138) * fVar138;
    fVar272 = fVar272 * fVar169 + (fStack_290 * fVar169 + fStack_190 * fVar139) * fVar139;
    fVar251 = fVar251 * fVar182 + (fStack_28c * fVar182 + fStack_18c * fVar154) * fVar154;
    fVar253 = fVar253 * fVar156 + (local_178 * fVar156 + local_1a8 * fVar137) * fVar137;
    fVar261 = fVar261 * fVar168 + (fStack_174 * fVar168 + fStack_1a4 * fVar138) * fVar138;
    fVar263 = fVar263 * fVar169 + (fStack_170 * fVar169 + fStack_1a0 * fVar139) * fVar139;
    fVar265 = fVar265 * fVar182 + (fStack_16c * fVar182 + fStack_19c * fVar154) * fVar154;
    fVar245 = fVar99 * fVar156 + (local_388 * fVar156 + local_1b8 * fVar137) * fVar137;
    fVar249 = fVar249 * fVar168 + (fStack_384 * fVar168 + fStack_1b4 * fVar138) * fVar138;
    fVar250 = fVar250 * fVar169 + (fStack_380 * fVar169 + fStack_1b0 * fVar139) * fVar139;
    fVar252 = fVar252 * fVar182 + (fStack_37c * fVar182 + fStack_1ac * fVar154) * fVar154;
    fVar273 = fVar156 * fVar196 + fVar137 * fVar260;
    fVar274 = fVar168 * fVar197 + fVar138 * fVar262;
    fVar275 = fVar169 * fVar198 + fVar139 * fVar264;
    fVar276 = fVar182 * fVar170 + fVar154 * fVar266;
    fVar277 = fVar156 * fVar181 + fVar137 * fVar270;
    fVar281 = fVar168 * fVar208 + fVar138 * fVar271;
    fVar282 = fVar169 * fVar209 + fVar139 * fVar272;
    fVar283 = fVar182 * fVar210 + fVar154 * fVar251;
    local_538 = fVar156 * fVar228 + fVar137 * fVar253;
    fStack_534 = fVar168 * fVar229 + fVar138 * fVar261;
    fStack_530 = fVar169 * fVar230 + fVar139 * fVar263;
    fStack_52c = fVar182 * fVar236 + fVar154 * fVar265;
    fVar99 = fVar180 * 0.11111111;
    fVar156 = fVar156 * fVar237 + fVar137 * fVar245;
    fVar168 = fVar168 * fVar238 + fVar138 * fVar249;
    auVar142._0_8_ = CONCAT44(fVar168,fVar156);
    auVar142._8_4_ = fVar169 * fVar243 + fVar139 * fVar250;
    auVar142._12_4_ = fVar182 * fVar244 + fVar154 * fVar252;
    fVar260 = (fVar260 - fVar196) * 3.0 * fVar99;
    local_4f8._0_4_ = (fVar262 - fVar197) * 3.0 * fVar99;
    local_4f8._4_4_ = (fVar264 - fVar198) * 3.0 * fVar99;
    fStack_4f0 = (fVar266 - fVar170) * 3.0 * fVar99;
    fVar262 = (fVar270 - fVar181) * 3.0 * fVar99;
    local_4d8 = (fVar271 - fVar208) * 3.0 * fVar99;
    fStack_4d4 = (fVar272 - fVar209) * 3.0 * fVar99;
    fStack_4d0 = (fVar251 - fVar210) * 3.0 * fVar99;
    local_4c8 = (fVar253 - fVar228) * 3.0 * fVar99;
    fStack_4c4 = (fVar261 - fVar229) * 3.0 * fVar99;
    fStack_4c0 = (fVar263 - fVar230) * 3.0 * fVar99;
    fStack_4bc = (fVar265 - fVar236) * 3.0 * fVar99;
    fVar137 = fVar99 * (fVar249 - fVar238) * 3.0;
    fVar138 = fVar99 * (fVar250 - fVar243) * 3.0;
    fVar139 = fVar99 * (fVar252 - fVar244) * 3.0;
    local_498._4_4_ = fVar275;
    local_498._0_4_ = fVar274;
    fStack_490 = fVar276;
    fStack_48c = 0.0;
    local_4a8._4_4_ = fVar282;
    local_4a8._0_4_ = fVar281;
    fStack_4a0 = fVar283;
    fStack_49c = 0.0;
    local_4b8._4_4_ = fStack_530;
    local_4b8._0_4_ = fStack_534;
    fStack_4b0 = fStack_52c;
    fStack_4ac = 0.0;
    auVar111._4_4_ = auVar142._8_4_;
    auVar111._0_4_ = fVar168;
    auVar111._8_4_ = auVar142._12_4_;
    auVar111._12_4_ = 0;
    local_688._4_4_ = fVar168 + fVar137;
    local_688._0_4_ = fVar156 + fVar99 * (fVar245 - fVar237) * 3.0;
    fStack_680 = auVar142._8_4_ + fVar138;
    fStack_67c = auVar142._12_4_ + fVar139;
    auVar112._0_8_ = CONCAT44(auVar142._8_4_ - fVar138,fVar168 - fVar137);
    auVar112._8_4_ = auVar142._12_4_ - fVar139;
    auVar112._12_4_ = 0;
    local_408._0_4_ = fVar281 - fVar277;
    local_408._4_4_ = fVar282 - fVar281;
    fStack_400 = fVar283 - fVar282;
    fStack_3fc = 0.0 - fVar283;
    local_418 = fStack_534 - local_538;
    fStack_414 = fStack_530 - fStack_534;
    fStack_410 = fStack_52c - fStack_530;
    fStack_40c = 0.0 - fStack_52c;
    fVar182 = fVar262 * local_418 - local_4c8 * (float)local_408._0_4_;
    fVar196 = local_4d8 * fStack_414 - fStack_4c4 * (float)local_408._4_4_;
    fVar197 = fStack_4d4 * fStack_410 - fStack_4c0 * fStack_400;
    fVar198 = fStack_4d0 * fStack_40c - fStack_4bc * fStack_3fc;
    local_1c8 = fVar274 - fVar273;
    fStack_1c4 = fVar275 - fVar274;
    fStack_1c0 = fVar276 - fVar275;
    fStack_1bc = 0.0 - fVar276;
    fVar154 = local_4c8 * local_1c8 - fVar260 * local_418;
    fVar156 = fStack_4c4 * fStack_1c4 - (float)local_4f8._0_4_ * fStack_414;
    fVar168 = fStack_4c0 * fStack_1c0 - (float)local_4f8._4_4_ * fStack_410;
    fVar169 = fStack_4bc * fStack_1bc - fStack_4f0 * fStack_40c;
    fVar170 = fVar260 * (float)local_408._0_4_ - fVar262 * local_1c8;
    fVar181 = (float)local_4f8._0_4_ * (float)local_408._4_4_ - local_4d8 * fStack_1c4;
    fVar208 = (float)local_4f8._4_4_ * fStack_400 - fStack_4d4 * fStack_1c0;
    fVar209 = fStack_4f0 * fStack_3fc - fStack_4d0 * fStack_1bc;
    auVar84._0_4_ = local_418 * local_418;
    auVar84._4_4_ = fStack_414 * fStack_414;
    auVar84._8_4_ = fStack_410 * fStack_410;
    auVar84._12_4_ = fStack_40c * fStack_40c;
    auVar225._0_4_ =
         local_1c8 * local_1c8 + (float)local_408._0_4_ * (float)local_408._0_4_ + auVar84._0_4_;
    auVar225._4_4_ =
         fStack_1c4 * fStack_1c4 + (float)local_408._4_4_ * (float)local_408._4_4_ + auVar84._4_4_;
    auVar225._8_4_ = fStack_1c0 * fStack_1c0 + fStack_400 * fStack_400 + auVar84._8_4_;
    auVar225._12_4_ = fStack_1bc * fStack_1bc + fStack_3fc * fStack_3fc + auVar84._12_4_;
    auVar70 = rcpps(auVar84,auVar225);
    fVar99 = auVar70._0_4_;
    fVar137 = auVar70._4_4_;
    fVar138 = auVar70._8_4_;
    fVar139 = auVar70._12_4_;
    fVar99 = (1.0 - fVar99 * auVar225._0_4_) * fVar99 + fVar99;
    fVar137 = (1.0 - fVar137 * auVar225._4_4_) * fVar137 + fVar137;
    fVar138 = (1.0 - fVar138 * auVar225._8_4_) * fVar138 + fVar138;
    fVar139 = (1.0 - fVar139 * auVar225._12_4_) * fVar139 + fVar139;
    fVar210 = local_418 * local_4d8 - (float)local_408._0_4_ * fStack_4c4;
    fVar228 = fStack_414 * fStack_4d4 - (float)local_408._4_4_ * fStack_4c0;
    fVar229 = fStack_410 * fStack_4d0 - fStack_400 * fStack_4bc;
    fVar230 = fStack_40c * 0.0 - fStack_3fc * 0.0;
    local_4e8 = fStack_4c4;
    fStack_4e4 = fStack_4c0;
    fStack_4e0 = fStack_4bc;
    fStack_4dc = 0.0;
    fVar236 = local_1c8 * fStack_4c4 - local_418 * (float)local_4f8._0_4_;
    fVar237 = fStack_1c4 * fStack_4c0 - fStack_414 * (float)local_4f8._4_4_;
    fVar238 = fStack_1c0 * fStack_4bc - fStack_410 * fStack_4f0;
    fVar243 = fStack_1bc * 0.0 - fStack_40c * 0.0;
    fStack_4cc = 0.0;
    uStack_4ec = 0;
    fVar244 = (float)local_408._0_4_ * (float)local_4f8._0_4_ - local_1c8 * local_4d8;
    fVar245 = (float)local_408._4_4_ * (float)local_4f8._4_4_ - fStack_1c4 * fStack_4d4;
    fVar249 = fStack_400 * fStack_4f0 - fStack_1c0 * fStack_4d0;
    fVar250 = fStack_3fc * 0.0 - fStack_1bc * 0.0;
    auVar204._0_4_ = (fVar182 * fVar182 + fVar154 * fVar154 + fVar170 * fVar170) * fVar99;
    auVar204._4_4_ = (fVar196 * fVar196 + fVar156 * fVar156 + fVar181 * fVar181) * fVar137;
    auVar204._8_4_ = (fVar197 * fVar197 + fVar168 * fVar168 + fVar208 * fVar208) * fVar138;
    auVar204._12_4_ = (fVar198 * fVar198 + fVar169 * fVar169 + fVar209 * fVar209) * fVar139;
    auVar232._0_4_ = (fVar210 * fVar210 + fVar236 * fVar236 + fVar244 * fVar244) * fVar99;
    auVar232._4_4_ = (fVar228 * fVar228 + fVar237 * fVar237 + fVar245 * fVar245) * fVar137;
    auVar232._8_4_ = (fVar229 * fVar229 + fVar238 * fVar238 + fVar249 * fVar249) * fVar138;
    auVar232._12_4_ = (fVar230 * fVar230 + fVar243 * fVar243 + fVar250 * fVar250) * fVar139;
    auVar205 = maxps(auVar204,auVar232);
    auVar188._8_4_ = auVar142._8_4_;
    auVar188._0_8_ = auVar142._0_8_;
    auVar188._12_4_ = auVar142._12_4_;
    auVar70 = maxps(auVar188,_local_688);
    auVar233._8_4_ = auVar112._8_4_;
    auVar233._0_8_ = auVar112._0_8_;
    auVar233._12_4_ = 0;
    auVar185 = maxps(auVar233,auVar111);
    auVar186 = maxps(auVar70,auVar185);
    auVar185 = minps(auVar142,_local_688);
    auVar70 = minps(auVar112,auVar111);
    auVar185 = minps(auVar185,auVar70);
    auVar70 = sqrtps(auVar70,auVar205);
    auVar143._0_4_ = auVar185._0_4_ - auVar70._0_4_;
    auVar143._4_4_ = auVar185._4_4_ - auVar70._4_4_;
    auVar143._8_4_ = auVar185._8_4_ - auVar70._8_4_;
    auVar143._12_4_ = auVar185._12_4_ - auVar70._12_4_;
    auVar185 = rsqrtps(auVar143,auVar225);
    fVar99 = auVar185._0_4_;
    fVar137 = auVar185._4_4_;
    fVar139 = auVar185._8_4_;
    fVar154 = auVar185._12_4_;
    fVar138 = fVar99 * fVar99 * auVar225._0_4_ * -0.5 * fVar99 + fVar99 * 1.5;
    fVar156 = fVar137 * fVar137 * auVar225._4_4_ * -0.5 * fVar137 + fVar137 * 1.5;
    fVar182 = fVar139 * fVar139 * auVar225._8_4_ * -0.5 * fVar139 + fVar139 * 1.5;
    fVar198 = fVar154 * fVar154 * auVar225._12_4_ * -0.5 * fVar154 + fVar154 * 1.5;
    fVar99 = 0.0 - fVar277;
    fVar139 = 0.0 - fVar281;
    fVar168 = 0.0 - fVar282;
    fVar196 = 0.0 - fVar283;
    fVar236 = 0.0 - local_538;
    fVar237 = 0.0 - fStack_534;
    fVar238 = 0.0 - fStack_530;
    fVar243 = 0.0 - fStack_52c;
    local_508 = 0.0 - fVar273;
    fStack_504 = 0.0 - fVar274;
    fStack_500 = 0.0 - fVar275;
    fStack_4fc = 0.0 - fVar276;
    fVar170 = local_458 * local_1c8 * fVar138 +
              (float)local_628._4_4_ * (float)local_408._0_4_ * fVar138 +
              fVar61 * local_418 * fVar138;
    fVar181 = fStack_454 * fStack_1c4 * fVar156 +
              (float)local_628._4_4_ * (float)local_408._4_4_ * fVar156 +
              fVar61 * fStack_414 * fVar156;
    fVar208 = fStack_450 * fStack_1c0 * fVar182 +
              (float)local_628._4_4_ * fStack_400 * fVar182 + fVar61 * fStack_410 * fVar182;
    fVar209 = fStack_44c * fStack_1bc * fVar198 +
              (float)local_628._4_4_ * fStack_3fc * fVar198 + fVar61 * fStack_40c * fVar198;
    fStack_2b0 = fVar208;
    local_2b8 = CONCAT44(fVar181,fVar170);
    fStack_2ac = fVar209;
    local_548 = local_1c8 * fVar138 * local_508 +
                (float)local_408._0_4_ * fVar138 * fVar99 + local_418 * fVar138 * fVar236;
    fStack_544 = fStack_1c4 * fVar156 * fStack_504 +
                 (float)local_408._4_4_ * fVar156 * fVar139 + fStack_414 * fVar156 * fVar237;
    fStack_540 = fStack_1c0 * fVar182 * fStack_500 +
                 fStack_400 * fVar182 * fVar168 + fStack_410 * fVar182 * fVar238;
    fStack_53c = fStack_1bc * fVar198 * fStack_4fc +
                 fStack_3fc * fVar198 * fVar196 + fStack_40c * fVar198 * fVar243;
    local_3f8._0_4_ =
         (local_458 * local_508 + (float)local_628._4_4_ * fVar99 + fVar61 * fVar236) -
         fVar170 * local_548;
    local_3f8._4_4_ =
         (fStack_454 * fStack_504 + (float)local_628._4_4_ * fVar139 + fVar61 * fVar237) -
         fVar181 * fStack_544;
    fStack_3f0 = (fStack_450 * fStack_500 + (float)local_628._4_4_ * fVar168 + fVar61 * fVar238) -
                 fVar208 * fStack_540;
    fStack_3ec = (fStack_44c * fStack_4fc + (float)local_628._4_4_ * fVar196 + fVar61 * fVar243) -
                 fVar209 * fStack_53c;
    fVar137 = (local_508 * local_508 + fVar99 * fVar99 + fVar236 * fVar236) - local_548 * local_548;
    fVar154 = (fStack_504 * fStack_504 + fVar139 * fVar139 + fVar237 * fVar237) -
              fStack_544 * fStack_544;
    fVar169 = (fStack_500 * fStack_500 + fVar168 * fVar168 + fVar238 * fVar238) -
              fStack_540 * fStack_540;
    fVar197 = (fStack_4fc * fStack_4fc + fVar196 * fVar196 + fVar243 * fVar243) -
              fStack_53c * fStack_53c;
    fVar210 = (auVar186._0_4_ + auVar70._0_4_) * 1.0000002;
    fVar228 = (auVar186._4_4_ + auVar70._4_4_) * 1.0000002;
    fVar229 = (auVar186._8_4_ + auVar70._8_4_) * 1.0000002;
    fVar230 = (auVar186._12_4_ + auVar70._12_4_) * 1.0000002;
    fVar210 = fVar137 - fVar210 * fVar210;
    fVar228 = fVar154 - fVar228 * fVar228;
    fVar229 = fVar169 - fVar229 * fVar229;
    fVar230 = fVar197 - fVar230 * fVar230;
    local_1d8 = fVar170 * fVar170;
    fStack_1d4 = fVar181 * fVar181;
    fStack_1d0 = fVar208 * fVar208;
    fStack_1cc = fVar209 * fVar209;
    local_2a8 = local_148 - local_1d8;
    fStack_2a4 = fStack_144 - fStack_1d4;
    fStack_2a0 = fStack_140 - fStack_1d0;
    fStack_29c = fStack_13c - fStack_1cc;
    local_3f8._0_4_ = (float)local_3f8._0_4_ + (float)local_3f8._0_4_;
    local_3f8._4_4_ = (float)local_3f8._4_4_ + (float)local_3f8._4_4_;
    fStack_3f0 = fStack_3f0 + fStack_3f0;
    fStack_3ec = fStack_3ec + fStack_3ec;
    local_518._0_4_ = (float)local_3f8._0_4_ * (float)local_3f8._0_4_;
    local_518._4_4_ = (float)local_3f8._4_4_ * (float)local_3f8._4_4_;
    fStack_510 = fStack_3f0 * fStack_3f0;
    fStack_50c = fStack_3ec * fStack_3ec;
    local_218 = local_2a8 * 4.0;
    fStack_214 = fStack_2a4 * 4.0;
    fStack_210 = fStack_2a0 * 4.0;
    fStack_20c = fStack_29c * 4.0;
    auVar189._0_4_ = (float)local_518._0_4_ - local_218 * fVar210;
    auVar189._4_4_ = (float)local_518._4_4_ - fStack_214 * fVar228;
    auVar189._8_4_ = fStack_510 - fStack_210 * fVar229;
    auVar189._12_4_ = fStack_50c - fStack_20c * fVar230;
    local_688._4_4_ = auVar143._4_4_ * 0.99999976;
    local_688._0_4_ = auVar143._0_4_ * 0.99999976;
    fStack_680 = auVar143._8_4_ * 0.99999976;
    fStack_67c = auVar143._12_4_ * 0.99999976;
    auVar246._4_4_ = -(uint)(0.0 <= auVar189._4_4_);
    auVar246._0_4_ = -(uint)(0.0 <= auVar189._0_4_);
    auVar246._8_4_ = -(uint)(0.0 <= auVar189._8_4_);
    auVar246._12_4_ = -(uint)(0.0 <= auVar189._12_4_);
    uVar48 = (undefined4)(uVar44 >> 0x20);
    iVar42 = movmskps((int)uVar44,auVar246);
    if (iVar42 == 0) {
      iVar42 = 0;
      auVar114 = _DAT_01f7a9f0;
      auVar234 = _DAT_01f7aa00;
    }
    else {
      auVar185 = sqrtps(_local_628,auVar189);
      bVar10 = 0.0 <= auVar189._0_4_;
      uVar56 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar189._4_4_;
      uVar57 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar189._8_4_;
      uVar58 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar189._12_4_;
      uVar59 = -(uint)bVar13;
      auVar113._0_4_ = local_2a8 + local_2a8;
      auVar113._4_4_ = fStack_2a4 + fStack_2a4;
      auVar113._8_4_ = fStack_2a0 + fStack_2a0;
      auVar113._12_4_ = fStack_29c + fStack_29c;
      auVar70 = rcpps(_local_2b8,auVar113);
      fVar244 = auVar70._0_4_;
      fVar245 = auVar70._4_4_;
      fVar249 = auVar70._8_4_;
      fVar250 = auVar70._12_4_;
      fVar244 = (1.0 - auVar113._0_4_ * fVar244) * fVar244 + fVar244;
      fVar245 = (1.0 - auVar113._4_4_ * fVar245) * fVar245 + fVar245;
      fVar249 = (1.0 - auVar113._8_4_ * fVar249) * fVar249 + fVar249;
      fVar250 = (1.0 - auVar113._12_4_ * fVar250) * fVar250 + fVar250;
      fVar252 = (-(float)local_3f8._0_4_ - auVar185._0_4_) * fVar244;
      fVar264 = (-(float)local_3f8._4_4_ - auVar185._4_4_) * fVar245;
      fVar266 = (-fStack_3f0 - auVar185._8_4_) * fVar249;
      fVar270 = (-fStack_3ec - auVar185._12_4_) * fVar250;
      fVar244 = (auVar185._0_4_ - (float)local_3f8._0_4_) * fVar244;
      fVar245 = (auVar185._4_4_ - (float)local_3f8._4_4_) * fVar245;
      fVar249 = (auVar185._8_4_ - fStack_3f0) * fVar249;
      fVar250 = (auVar185._12_4_ - fStack_3ec) * fVar250;
      local_238 = (fVar170 * fVar252 + local_548) * fVar138;
      fStack_234 = (fVar181 * fVar264 + fStack_544) * fVar156;
      fStack_230 = (fVar208 * fVar266 + fStack_540) * fVar182;
      fStack_22c = (fVar209 * fVar270 + fStack_53c) * fVar198;
      local_228 = (fVar170 * fVar244 + local_548) * fVar138;
      fStack_224 = (fVar181 * fVar245 + fStack_544) * fVar156;
      fStack_220 = (fVar208 * fVar249 + fStack_540) * fVar182;
      fStack_21c = (fVar209 * fVar250 + fStack_53c) * fVar198;
      auVar114._0_8_ = CONCAT44(~uVar57,~uVar56) & 0x7f8000007f800000;
      auVar114._8_4_ = ~uVar58 & 0x7f800000;
      auVar114._12_4_ = ~uVar59 & 0x7f800000;
      auVar14._4_4_ = (uint)fVar264 & uVar57;
      auVar14._0_4_ = (uint)fVar252 & uVar56;
      auVar14._8_4_ = (uint)fVar266 & uVar58;
      auVar14._12_4_ = (uint)fVar270 & uVar59;
      auVar114 = auVar114 | auVar14;
      auVar278._0_4_ = (uint)fVar244 & uVar56;
      auVar278._4_4_ = (uint)fVar245 & uVar57;
      auVar278._8_4_ = (uint)fVar249 & uVar58;
      auVar278._12_4_ = (uint)fVar250 & uVar59;
      auVar234._0_8_ = CONCAT44(~uVar57,~uVar56) & 0xff800000ff800000;
      auVar234._8_4_ = ~uVar58 & 0xff800000;
      auVar234._12_4_ = ~uVar59 & 0xff800000;
      auVar234 = auVar234 | auVar278;
      auVar258._0_8_ = CONCAT44(fStack_1d4,local_1d8) & 0x7fffffff7fffffff;
      auVar258._8_4_ = ABS(fStack_1d0);
      auVar258._12_4_ = ABS(fStack_1cc);
      auVar21._4_4_ = fStack_394;
      auVar21._0_4_ = local_398;
      auVar21._8_4_ = fStack_390;
      auVar21._12_4_ = fStack_38c;
      auVar70 = maxps(auVar21,auVar258);
      fVar170 = auVar70._0_4_ * 1.9073486e-06;
      fVar181 = auVar70._4_4_ * 1.9073486e-06;
      fVar208 = auVar70._8_4_ * 1.9073486e-06;
      fVar209 = auVar70._12_4_ * 1.9073486e-06;
      auVar279._0_4_ = -(uint)(ABS(local_2a8) < fVar170 && bVar10);
      auVar279._4_4_ = -(uint)(ABS(fStack_2a4) < fVar181 && bVar11);
      auVar279._8_4_ = -(uint)(ABS(fStack_2a0) < fVar208 && bVar12);
      auVar279._12_4_ = -(uint)(ABS(fStack_29c) < fVar209 && bVar13);
      iVar42 = movmskps(iVar42,auVar279);
      if (iVar42 != 0) {
        uVar56 = -(uint)(fVar210 <= 0.0);
        uVar57 = -(uint)(fVar228 <= 0.0);
        uVar58 = -(uint)(fVar229 <= 0.0);
        uVar59 = -(uint)(fVar230 <= 0.0);
        auVar285._0_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar279._0_4_;
        auVar285._4_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar279._4_4_;
        auVar285._8_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar279._8_4_;
        auVar285._12_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar279._12_4_;
        auVar153._0_4_ = ~auVar279._0_4_ & auVar114._0_4_;
        auVar153._4_4_ = ~auVar279._4_4_ & auVar114._4_4_;
        auVar153._8_4_ = ~auVar279._8_4_ & auVar114._8_4_;
        auVar153._12_4_ = ~auVar279._12_4_ & auVar114._12_4_;
        auVar114 = auVar153 | auVar285;
        auVar269._0_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar279._0_4_;
        auVar269._4_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar279._4_4_;
        auVar269._8_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar279._8_4_;
        auVar269._12_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar279._12_4_;
        auVar280._0_4_ = ~auVar279._0_4_ & auVar234._0_4_;
        auVar280._4_4_ = ~auVar279._4_4_ & auVar234._4_4_;
        auVar280._8_4_ = ~auVar279._8_4_ & auVar234._8_4_;
        auVar280._12_4_ = ~auVar279._12_4_ & auVar234._12_4_;
        auVar234 = auVar280 | auVar269;
        auVar246._0_4_ = -(uint)((fVar170 <= ABS(local_2a8) || fVar210 <= 0.0) && bVar10);
        auVar246._4_4_ = -(uint)((fVar181 <= ABS(fStack_2a4) || fVar228 <= 0.0) && bVar11);
        auVar246._8_4_ = -(uint)((fVar208 <= ABS(fStack_2a0) || fVar229 <= 0.0) && bVar12);
        auVar246._12_4_ = -(uint)((fVar209 <= ABS(fStack_29c) || fVar230 <= 0.0) && bVar13);
      }
    }
    auVar247._0_4_ = (auVar246._0_4_ << 0x1f) >> 0x1f;
    auVar247._4_4_ = (auVar246._4_4_ << 0x1f) >> 0x1f;
    auVar247._8_4_ = (auVar246._8_4_ << 0x1f) >> 0x1f;
    auVar247._12_4_ = (auVar246._12_4_ << 0x1f) >> 0x1f;
    auVar247 = auVar247 & local_208;
    iVar42 = movmskps(iVar42,auVar247);
    pauVar47 = (undefined1 (*) [16])CONCAT44(uVar48,iVar42);
    if (iVar42 != 0) {
      auVar70 = _local_2b8;
      fVar170 = *(float *)(ray + k * 4 + 0x80);
      auVar284._0_4_ = fVar170 - (float)local_3e8._0_4_;
      auVar284._4_4_ = auVar284._0_4_;
      auVar284._8_4_ = auVar284._0_4_;
      auVar284._12_4_ = auVar284._0_4_;
      auVar205 = minps(auVar284,auVar234);
      auVar25._4_4_ = fStack_1f4;
      auVar25._0_4_ = local_1f8;
      auVar25._8_4_ = fStack_1f0;
      auVar25._12_4_ = fStack_1ec;
      auVar186 = maxps(auVar25,auVar114);
      auVar115._0_4_ = fVar262 * (float)local_628._4_4_ + local_4c8 * fVar61;
      auVar115._4_4_ = local_4d8 * (float)local_628._4_4_ + fStack_4c4 * fVar61;
      auVar115._8_4_ = fStack_4d4 * (float)local_628._4_4_ + fStack_4c0 * fVar61;
      auVar115._12_4_ = fStack_4d0 * (float)local_628._4_4_ + fStack_4bc * fVar61;
      auVar239._0_4_ = fVar260 * local_458 + auVar115._0_4_;
      auVar239._4_4_ = (float)local_4f8._0_4_ * fStack_454 + auVar115._4_4_;
      auVar239._8_4_ = (float)local_4f8._4_4_ * fStack_450 + auVar115._8_4_;
      auVar239._12_4_ = fStack_4f0 * fStack_44c + auVar115._12_4_;
      auVar185 = rcpps(auVar115,auVar239);
      fVar181 = auVar185._0_4_;
      fVar208 = auVar185._4_4_;
      fVar209 = auVar185._8_4_;
      fVar210 = auVar185._12_4_;
      fVar99 = ((1.0 - auVar239._0_4_ * fVar181) * fVar181 + fVar181) *
               -(local_508 * fVar260 + fVar99 * fVar262 + fVar236 * local_4c8);
      fVar139 = ((1.0 - auVar239._4_4_ * fVar208) * fVar208 + fVar208) *
                -(fStack_504 * (float)local_4f8._0_4_ + fVar139 * local_4d8 + fVar237 * fStack_4c4);
      fVar168 = ((1.0 - auVar239._8_4_ * fVar209) * fVar209 + fVar209) *
                -(fStack_500 * (float)local_4f8._4_4_ + fVar168 * fStack_4d4 + fVar238 * fStack_4c0)
      ;
      fVar196 = ((1.0 - auVar239._12_4_ * fVar210) * fVar210 + fVar210) *
                -(fStack_4fc * fStack_4f0 + fVar196 * fStack_4d0 + fVar243 * fStack_4bc);
      uVar56 = -(uint)(auVar239._0_4_ < 0.0 || ABS(auVar239._0_4_) < 1e-18);
      uVar57 = -(uint)(auVar239._4_4_ < 0.0 || ABS(auVar239._4_4_) < 1e-18);
      uVar58 = -(uint)(auVar239._8_4_ < 0.0 || ABS(auVar239._8_4_) < 1e-18);
      uVar59 = -(uint)(auVar239._12_4_ < 0.0 || ABS(auVar239._12_4_) < 1e-18);
      auVar158._0_8_ = CONCAT44(uVar57,uVar56) & 0xff800000ff800000;
      auVar158._8_4_ = uVar58 & 0xff800000;
      auVar158._12_4_ = uVar59 & 0xff800000;
      auVar116._0_4_ = ~uVar56 & (uint)fVar99;
      auVar116._4_4_ = ~uVar57 & (uint)fVar139;
      auVar116._8_4_ = ~uVar58 & (uint)fVar168;
      auVar116._12_4_ = ~uVar59 & (uint)fVar196;
      auVar186 = maxps(auVar186,auVar116 | auVar158);
      uVar56 = -(uint)(0.0 < auVar239._0_4_ || ABS(auVar239._0_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar239._4_4_ || ABS(auVar239._4_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar239._8_4_ || ABS(auVar239._8_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar239._12_4_ || ABS(auVar239._12_4_) < 1e-18);
      auVar117._0_8_ = CONCAT44(uVar57,uVar56) & 0x7f8000007f800000;
      auVar117._8_4_ = uVar58 & 0x7f800000;
      auVar117._12_4_ = uVar59 & 0x7f800000;
      auVar240._0_4_ = ~uVar56 & (uint)fVar99;
      auVar240._4_4_ = ~uVar57 & (uint)fVar139;
      auVar240._8_4_ = ~uVar58 & (uint)fVar168;
      auVar240._12_4_ = ~uVar59 & (uint)fVar196;
      auVar205 = minps(auVar205,auVar240 | auVar117);
      auVar159._0_4_ = (0.0 - fVar281) * -local_4d8 + (0.0 - fStack_534) * -fStack_4c4;
      auVar159._4_4_ = (0.0 - fVar282) * -fStack_4d4 + (0.0 - fStack_530) * -fStack_4c0;
      auVar159._8_4_ = (0.0 - fVar283) * -fStack_4d0 + (0.0 - fStack_52c) * -fStack_4bc;
      auVar159._12_4_ = 0x80000000;
      auVar173._0_4_ =
           -(float)local_4f8._0_4_ * local_458 +
           -local_4d8 * (float)local_628._4_4_ + -fStack_4c4 * fVar61;
      auVar173._4_4_ =
           -(float)local_4f8._4_4_ * fStack_454 +
           -fStack_4d4 * (float)local_628._4_4_ + -fStack_4c0 * fVar61;
      auVar173._8_4_ =
           -fStack_4f0 * fStack_450 + -fStack_4d0 * (float)local_628._4_4_ + -fStack_4bc * fVar61;
      auVar173._12_4_ = fStack_44c * -0.0 + (float)local_628._4_4_ * -0.0 + fVar61 * -0.0;
      auVar185 = rcpps(auVar159,auVar173);
      fVar99 = auVar185._0_4_;
      fVar139 = auVar185._4_4_;
      fVar168 = auVar185._8_4_;
      fVar196 = auVar185._12_4_;
      fVar99 = (((float)DAT_01f7ba10 - auVar173._0_4_ * fVar99) * fVar99 + fVar99) *
               -((0.0 - fVar274) * -(float)local_4f8._0_4_ + auVar159._0_4_);
      fVar139 = ((DAT_01f7ba10._4_4_ - auVar173._4_4_ * fVar139) * fVar139 + fVar139) *
                -((0.0 - fVar275) * -(float)local_4f8._4_4_ + auVar159._4_4_);
      fVar168 = ((DAT_01f7ba10._8_4_ - auVar173._8_4_ * fVar168) * fVar168 + fVar168) *
                -((0.0 - fVar276) * -fStack_4f0 + auVar159._8_4_);
      fVar196 = ((DAT_01f7ba10._12_4_ - auVar173._12_4_ * fVar196) * fVar196 + fVar196) * 0.0;
      uVar56 = -(uint)(auVar173._0_4_ < 0.0 || ABS(auVar173._0_4_) < 1e-18);
      uVar57 = -(uint)(auVar173._4_4_ < 0.0 || ABS(auVar173._4_4_) < 1e-18);
      uVar58 = -(uint)(auVar173._8_4_ < 0.0 || ABS(auVar173._8_4_) < 1e-18);
      uVar59 = -(uint)(auVar173._12_4_ < 0.0 || ABS(auVar173._12_4_) < 1e-18);
      auVar160._0_8_ = CONCAT44(uVar57,uVar56) & 0xff800000ff800000;
      auVar160._8_4_ = uVar58 & 0xff800000;
      auVar160._12_4_ = uVar59 & 0xff800000;
      auVar118._0_4_ = ~uVar56 & (uint)fVar99;
      auVar118._4_4_ = ~uVar57 & (uint)fVar139;
      auVar118._8_4_ = ~uVar58 & (uint)fVar168;
      auVar118._12_4_ = ~uVar59 & (uint)fVar196;
      auVar185 = maxps(auVar186,auVar118 | auVar160);
      uVar56 = -(uint)(0.0 < auVar173._0_4_ || ABS(auVar173._0_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar173._4_4_ || ABS(auVar173._4_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar173._8_4_ || ABS(auVar173._8_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar173._12_4_ || ABS(auVar173._12_4_) < 1e-18);
      auVar119._0_8_ = CONCAT44(uVar57,uVar56) & 0x7f8000007f800000;
      auVar119._8_4_ = uVar58 & 0x7f800000;
      auVar119._12_4_ = uVar59 & 0x7f800000;
      auVar174._0_4_ = ~uVar56 & (uint)fVar99;
      auVar174._4_4_ = ~uVar57 & (uint)fVar139;
      auVar174._8_4_ = ~uVar58 & (uint)fVar168;
      auVar174._12_4_ = ~uVar59 & (uint)fVar196;
      local_2d8 = minps(auVar205,auVar174 | auVar119);
      fVar99 = auVar185._12_4_;
      fVar139 = auVar185._0_4_;
      fVar168 = auVar185._4_4_;
      fVar196 = auVar185._8_4_;
      local_5c8._0_4_ = auVar247._0_4_;
      local_5c8._4_4_ = auVar247._4_4_;
      uStack_5c0 = auVar247._8_4_;
      uStack_5bc = auVar247._12_4_;
      auVar259._0_8_ =
           CONCAT44(-(uint)(fVar168 <= local_2d8._4_4_) & local_5c8._4_4_,
                    -(uint)(fVar139 <= local_2d8._0_4_) & (uint)local_5c8);
      auVar259._8_4_ = -(uint)(fVar196 <= local_2d8._8_4_) & uStack_5c0;
      auVar259._12_4_ = -(uint)(fVar99 <= local_2d8._12_4_) & uStack_5bc;
      iVar42 = movmskps(iVar42,auVar259);
      pauVar47 = (undefined1 (*) [16])CONCAT44(uVar48,iVar42);
      if (iVar42 != 0) {
        auVar205 = maxps(ZEXT816(0),_local_688);
        auVar23._4_4_ = fStack_234;
        auVar23._0_4_ = local_238;
        auVar23._8_4_ = fStack_230;
        auVar23._12_4_ = fStack_22c;
        auVar186 = minps(auVar23,_DAT_01f7ba10);
        auVar226 = maxps(auVar186,ZEXT816(0));
        auVar24._4_4_ = fStack_224;
        auVar24._0_4_ = local_228;
        auVar24._8_4_ = fStack_220;
        auVar24._12_4_ = fStack_21c;
        auVar186 = minps(auVar24,_DAT_01f7ba10);
        auVar186 = maxps(auVar186,ZEXT816(0));
        local_108._0_4_ = (auVar226._0_4_ + 0.0) * 0.25 * fVar180 + local_1e8;
        local_108._4_4_ = (auVar226._4_4_ + 1.0) * 0.25 * fVar180 + local_1e8;
        local_108._8_4_ = (auVar226._8_4_ + 2.0) * 0.25 * fVar180 + local_1e8;
        local_108._12_4_ = (auVar226._12_4_ + 3.0) * 0.25 * fVar180 + local_1e8;
        auVar144._0_12_ = ZEXT812(0);
        auVar144._12_4_ = 0;
        local_118[0] = (auVar186._0_4_ + 0.0) * 0.25 * fVar180 + local_1e8;
        local_118[1] = (auVar186._4_4_ + 1.0) * 0.25 * fVar180 + local_1e8;
        local_118[2] = (auVar186._8_4_ + 2.0) * 0.25 * fVar180 + local_1e8;
        local_118[3] = (auVar186._12_4_ + 3.0) * 0.25 * fVar180 + local_1e8;
        fVar137 = fVar137 - auVar205._0_4_ * auVar205._0_4_;
        fVar154 = fVar154 - auVar205._4_4_ * auVar205._4_4_;
        fVar169 = fVar169 - auVar205._8_4_ * auVar205._8_4_;
        fVar197 = fVar197 - auVar205._12_4_ * auVar205._12_4_;
        auVar85._0_4_ = (float)local_518._0_4_ - local_218 * fVar137;
        auVar85._4_4_ = (float)local_518._4_4_ - fStack_214 * fVar154;
        auVar85._8_4_ = fStack_510 - fStack_210 * fVar169;
        auVar85._12_4_ = fStack_50c - fStack_20c * fVar197;
        local_518._4_4_ = -(uint)(0.0 <= auVar85._4_4_);
        local_518._0_4_ = -(uint)(0.0 <= auVar85._0_4_);
        fStack_510 = (float)-(uint)(0.0 <= auVar85._8_4_);
        fStack_50c = (float)-(uint)(0.0 <= auVar85._12_4_);
        iVar42 = movmskps(iVar42,_local_518);
        auVar248._4_4_ = fVar101;
        auVar248._0_4_ = fVar100;
        auVar248._8_4_ = fVar102;
        auVar248._12_4_ = fVar103;
        if (iVar42 == 0) {
          _local_638 = ZEXT816(0);
          fVar180 = 0.0;
          fVar181 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          fVar138 = 0.0;
          fVar156 = 0.0;
          fVar182 = 0.0;
          fVar198 = 0.0;
          fVar236 = 0.0;
          fVar237 = 0.0;
          fVar238 = 0.0;
          fVar243 = 0.0;
          fVar210 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          _local_568 = ZEXT816(0);
          iVar42 = 0;
          auVar86 = _DAT_01f7a9f0;
          auVar207 = _DAT_01f7aa00;
        }
        else {
          auVar205 = sqrtps(local_108,auVar85);
          auVar120._0_4_ = local_2a8 + local_2a8;
          auVar120._4_4_ = fStack_2a4 + fStack_2a4;
          auVar120._8_4_ = fStack_2a0 + fStack_2a0;
          auVar120._12_4_ = fStack_29c + fStack_29c;
          auVar186 = rcpps(auVar144,auVar120);
          fVar244 = auVar186._0_4_;
          fVar245 = auVar186._4_4_;
          fVar249 = auVar186._8_4_;
          fVar250 = auVar186._12_4_;
          fVar244 = ((float)DAT_01f7ba10 - auVar120._0_4_ * fVar244) * fVar244 + fVar244;
          fVar245 = (DAT_01f7ba10._4_4_ - auVar120._4_4_ * fVar245) * fVar245 + fVar245;
          fVar249 = (DAT_01f7ba10._8_4_ - auVar120._8_4_ * fVar249) * fVar249 + fVar249;
          fVar250 = (DAT_01f7ba10._12_4_ - auVar120._12_4_ * fVar250) * fVar250 + fVar250;
          fVar252 = (-(float)local_3f8._0_4_ - auVar205._0_4_) * fVar244;
          fVar260 = (-(float)local_3f8._4_4_ - auVar205._4_4_) * fVar245;
          fVar262 = (-fStack_3f0 - auVar205._8_4_) * fVar249;
          fVar264 = (-fStack_3ec - auVar205._12_4_) * fVar250;
          fVar244 = (auVar205._0_4_ - (float)local_3f8._0_4_) * fVar244;
          fVar245 = (auVar205._4_4_ - (float)local_3f8._4_4_) * fVar245;
          fVar249 = (auVar205._8_4_ - fStack_3f0) * fVar249;
          fVar250 = (auVar205._12_4_ - fStack_3ec) * fVar250;
          fVar180 = ((float)local_2b8._0_4_ * fVar252 + local_548) * fVar138;
          fVar181 = ((float)local_2b8._4_4_ * fVar260 + fStack_544) * fVar156;
          fVar208 = (fStack_2b0 * fVar262 + fStack_540) * fVar182;
          fVar209 = (fStack_2ac * fVar264 + fStack_53c) * fVar198;
          fVar236 = local_458 * fVar252 - (local_1c8 * fVar180 + fVar273);
          fVar237 = fStack_454 * fVar260 - (fStack_1c4 * fVar181 + fVar274);
          fVar238 = fStack_450 * fVar262 - (fStack_1c0 * fVar208 + fVar275);
          fVar243 = fStack_44c * fVar264 - (fStack_1bc * fVar209 + fVar276);
          fVar210 = (float)local_628._4_4_ * fVar252 - ((float)local_408._0_4_ * fVar180 + fVar277);
          fVar228 = (float)local_628._4_4_ * fVar260 - ((float)local_408._4_4_ * fVar181 + fVar281);
          fVar229 = (float)local_628._4_4_ * fVar262 - (fStack_400 * fVar208 + fVar282);
          fVar230 = (float)local_628._4_4_ * fVar264 - (fStack_3fc * fVar209 + fVar283);
          local_568._4_4_ = fVar61 * fVar260 - (fVar181 * fStack_414 + fStack_534);
          local_568._0_4_ = fVar61 * fVar252 - (fVar180 * local_418 + local_538);
          fStack_560 = fVar61 * fVar262 - (fVar208 * fStack_410 + fStack_530);
          fStack_55c = fVar61 * fVar264 - (fVar209 * fStack_40c + fStack_52c);
          fVar138 = ((float)local_2b8._0_4_ * fVar244 + local_548) * fVar138;
          fVar156 = ((float)local_2b8._4_4_ * fVar245 + fStack_544) * fVar156;
          fVar182 = (fStack_2b0 * fVar249 + fStack_540) * fVar182;
          fVar198 = (fStack_2ac * fVar250 + fStack_53c) * fVar198;
          local_638._4_4_ = fStack_454 * fVar245 - (fStack_1c4 * fVar156 + fVar274);
          local_638._0_4_ = local_458 * fVar244 - (local_1c8 * fVar138 + fVar273);
          fStack_630 = fStack_450 * fVar249 - (fStack_1c0 * fVar182 + fVar275);
          fStack_62c = fStack_44c * fVar250 - (fStack_1bc * fVar198 + fVar276);
          fVar180 = (float)local_628._4_4_ * fVar244 - ((float)local_408._0_4_ * fVar138 + fVar277);
          fVar181 = (float)local_628._4_4_ * fVar245 - ((float)local_408._4_4_ * fVar156 + fVar281);
          fVar208 = (float)local_628._4_4_ * fVar249 - (fStack_400 * fVar182 + fVar282);
          fVar209 = (float)local_628._4_4_ * fVar250 - (fStack_3fc * fVar198 + fVar283);
          bVar10 = 0.0 <= auVar85._0_4_;
          uVar56 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar85._4_4_;
          uVar57 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar85._8_4_;
          uVar58 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar85._12_4_;
          uVar59 = -(uint)bVar13;
          fVar138 = fVar61 * fVar244 - (fVar138 * local_418 + local_538);
          fVar156 = fVar61 * fVar245 - (fVar156 * fStack_414 + fStack_534);
          fVar182 = fVar61 * fVar249 - (fVar182 * fStack_410 + fStack_530);
          fVar198 = fVar61 * fVar250 - (fVar198 * fStack_40c + fStack_52c);
          auVar206._0_4_ = (uint)fVar252 & uVar56;
          auVar206._4_4_ = (uint)fVar260 & uVar57;
          auVar206._8_4_ = (uint)fVar262 & uVar58;
          auVar206._12_4_ = (uint)fVar264 & uVar59;
          auVar86._0_8_ = CONCAT44(~uVar57,~uVar56) & 0x7f8000007f800000;
          auVar86._8_4_ = ~uVar58 & 0x7f800000;
          auVar86._12_4_ = ~uVar59 & 0x7f800000;
          auVar86 = auVar86 | auVar206;
          auVar227._0_4_ = (uint)fVar244 & uVar56;
          auVar227._4_4_ = (uint)fVar245 & uVar57;
          auVar227._8_4_ = (uint)fVar249 & uVar58;
          auVar227._12_4_ = (uint)fVar250 & uVar59;
          auVar207._0_8_ = CONCAT44(~uVar57,~uVar56) & 0xff800000ff800000;
          auVar207._8_4_ = ~uVar58 & 0xff800000;
          auVar207._12_4_ = ~uVar59 & 0xff800000;
          auVar207 = auVar207 | auVar227;
          auVar121._0_8_ = CONCAT44(fStack_1d4,local_1d8) & 0x7fffffff7fffffff;
          auVar121._8_4_ = ABS(fStack_1d0);
          auVar121._12_4_ = ABS(fStack_1cc);
          auVar22._4_4_ = fStack_394;
          auVar22._0_4_ = local_398;
          auVar22._8_4_ = fStack_390;
          auVar22._12_4_ = fStack_38c;
          auVar186 = maxps(auVar22,auVar121);
          fVar244 = auVar186._0_4_ * 1.9073486e-06;
          fVar245 = auVar186._4_4_ * 1.9073486e-06;
          fVar249 = auVar186._8_4_ * 1.9073486e-06;
          fVar250 = auVar186._12_4_ * 1.9073486e-06;
          auVar190._0_4_ = -(uint)(ABS(local_2a8) < fVar244 && bVar10);
          auVar190._4_4_ = -(uint)(ABS(fStack_2a4) < fVar245 && bVar11);
          auVar190._8_4_ = -(uint)(ABS(fStack_2a0) < fVar249 && bVar12);
          auVar190._12_4_ = -(uint)(ABS(fStack_29c) < fVar250 && bVar13);
          iVar42 = movmskps(iVar42,auVar190);
          if (iVar42 != 0) {
            uVar56 = -(uint)(fVar137 <= 0.0);
            uVar57 = -(uint)(fVar154 <= 0.0);
            uVar58 = -(uint)(fVar169 <= 0.0);
            uVar59 = -(uint)(fVar197 <= 0.0);
            auVar241._0_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar190._0_4_;
            auVar241._4_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar190._4_4_;
            auVar241._8_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar190._8_4_;
            auVar241._12_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar190._12_4_;
            auVar235._0_4_ = ~auVar190._0_4_ & auVar86._0_4_;
            auVar235._4_4_ = ~auVar190._4_4_ & auVar86._4_4_;
            auVar235._8_4_ = ~auVar190._8_4_ & auVar86._8_4_;
            auVar235._12_4_ = ~auVar190._12_4_ & auVar86._12_4_;
            auVar86 = auVar235 | auVar241;
            auVar242._0_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar190._0_4_;
            auVar242._4_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar190._4_4_;
            auVar242._8_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar190._8_4_;
            auVar242._12_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar190._12_4_;
            auVar195._0_4_ = ~auVar190._0_4_ & auVar207._0_4_;
            auVar195._4_4_ = ~auVar190._4_4_ & auVar207._4_4_;
            auVar195._8_4_ = ~auVar190._8_4_ & auVar207._8_4_;
            auVar195._12_4_ = ~auVar190._12_4_ & auVar207._12_4_;
            auVar207 = auVar195 | auVar242;
            local_518._4_4_ = -(uint)((fVar245 <= ABS(fStack_2a4) || fVar154 <= 0.0) && bVar11);
            local_518._0_4_ = -(uint)((fVar244 <= ABS(local_2a8) || fVar137 <= 0.0) && bVar10);
            fStack_510 = (float)-(uint)((fVar249 <= ABS(fStack_2a0) || fVar169 <= 0.0) && bVar12);
            fStack_50c = (float)-(uint)((fVar250 <= ABS(fStack_29c) || fVar197 <= 0.0) && bVar13);
          }
        }
        fVar137 = (float)local_638._0_4_ * local_458;
        fVar154 = (float)local_638._4_4_ * fStack_454;
        fStack_630 = fStack_630 * fStack_450;
        fStack_62c = fStack_62c * fStack_44c;
        _local_138 = auVar185;
        local_128 = minps(local_2d8,auVar86);
        auVar186 = maxps(auVar185,auVar207);
        local_2e8 = auVar186;
        local_3f8._0_4_ = -(uint)(fVar139 <= local_128._0_4_) & auVar259._0_4_;
        local_3f8._4_4_ = -(uint)(fVar168 <= local_128._4_4_) & auVar259._4_4_;
        fStack_3f0 = (float)(-(uint)(fVar196 <= local_128._8_4_) & auVar259._8_4_);
        fStack_3ec = (float)(-(uint)(fVar99 <= local_128._12_4_) & auVar259._12_4_);
        local_408 = (undefined1  [8])
                    CONCAT44(-(uint)(auVar186._4_4_ <= local_2d8._4_4_) & auVar259._4_4_,
                             -(uint)(auVar186._0_4_ <= local_2d8._0_4_) & auVar259._0_4_);
        fStack_400 = (float)(-(uint)(auVar186._8_4_ <= local_2d8._8_4_) & auVar259._8_4_);
        fStack_3fc = (float)(-(uint)(auVar186._12_4_ <= local_2d8._12_4_) & auVar259._12_4_);
        auVar87._8_4_ = fStack_400;
        auVar87._0_8_ = local_408;
        auVar87._12_4_ = fStack_3fc;
        iVar42 = movmskps(iVar42,auVar87 | _local_3f8);
        pauVar47 = (undefined1 (*) [16])CONCAT44(uVar48,iVar42);
        if (iVar42 != 0) {
          local_418 = (float)iVar49;
          fStack_414 = (float)iVar49;
          fStack_410 = (float)iVar49;
          fStack_40c = (float)iVar49;
          local_568._0_4_ =
               -(uint)(iVar49 < ((int)((-(uint)(0.3 <= ABS((float)local_568._0_4_ * fVar61 +
                                                           fVar210 * (float)local_628._4_4_ +
                                                           fVar236 * local_458)) & local_518._0_4_)
                                      << 0x1f) >> 0x1f) + 4);
          local_568._4_4_ =
               -(uint)(iVar49 < ((int)((-(uint)(0.3 <= ABS((float)local_568._4_4_ * fVar61 +
                                                           fVar228 * (float)local_628._4_4_ +
                                                           fVar237 * fStack_454)) & local_518._4_4_)
                                      << 0x1f) >> 0x1f) + 4);
          fStack_560 = (float)-(uint)(iVar49 < ((int)((-(uint)(0.3 <= ABS(fStack_560 * fVar61 +
                                                                          fVar229 * (float)local_628
                                                  ._4_4_ + fVar238 * fStack_450)) & (uint)fStack_510
                                                  ) << 0x1f) >> 0x1f) + 4);
          fStack_55c = (float)-(uint)(iVar49 < ((int)((-(uint)(0.3 <= ABS(fStack_55c * fVar61 +
                                                                          fVar230 * (float)local_628
                                                  ._4_4_ + fVar243 * fStack_44c)) & (uint)fStack_50c
                                                  ) << 0x1f) >> 0x1f) + 4);
          local_3c8 = ~_local_568 & _local_3f8;
          iVar42 = movmskps(iVar42,local_3c8);
          _local_2b8 = auVar70;
          if (iVar42 != 0) {
            local_548 = local_558 + fVar139;
            fStack_544 = fStack_554 + fVar168;
            fStack_540 = fStack_550 + fVar196;
            fStack_53c = fStack_54c + fVar99;
            do {
              auVar205 = ~local_3c8 & _DAT_01f7a9f0 | local_3c8 & auVar185;
              auVar161._4_4_ = auVar205._0_4_;
              auVar161._0_4_ = auVar205._4_4_;
              auVar161._8_4_ = auVar205._12_4_;
              auVar161._12_4_ = auVar205._8_4_;
              auVar70 = minps(auVar161,auVar205);
              auVar122._0_8_ = auVar70._8_8_;
              auVar122._8_4_ = auVar70._0_4_;
              auVar122._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar122,auVar70);
              auVar123._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar205._4_4_) & local_3c8._4_4_,
                            -(uint)(auVar70._0_4_ == auVar205._0_4_) & local_3c8._0_4_);
              auVar123._8_4_ = -(uint)(auVar70._8_4_ == auVar205._8_4_) & local_3c8._8_4_;
              auVar123._12_4_ = -(uint)(auVar70._12_4_ == auVar205._12_4_) & local_3c8._12_4_;
              iVar42 = movmskps(iVar42,auVar123);
              auVar88 = local_3c8;
              if (iVar42 != 0) {
                auVar88._8_4_ = auVar123._8_4_;
                auVar88._0_8_ = auVar123._0_8_;
                auVar88._12_4_ = auVar123._12_4_;
              }
              uVar43 = movmskps(iVar42,auVar88);
              uVar44 = 0;
              if (CONCAT44(uVar48,uVar43) != 0) {
                for (; (CONCAT44(uVar48,uVar43) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + uVar44 * 4) = 0;
              auVar19._4_4_ = fStack_424;
              auVar19._0_4_ = local_428;
              auVar19._8_4_ = fStack_420;
              auVar19._12_4_ = fStack_41c;
              auVar205 = minps(auVar248,auVar19);
              auVar226 = maxps(auVar248,auVar19);
              auVar17._4_4_ = fStack_434;
              auVar17._0_4_ = local_438;
              auVar17._8_4_ = fStack_430;
              auVar17._12_4_ = fStack_42c;
              auVar15._4_4_ = fStack_444;
              auVar15._0_4_ = local_448;
              auVar15._8_4_ = fStack_440;
              auVar15._12_4_ = fStack_43c;
              auVar70 = minps(auVar17,auVar15);
              auVar205 = minps(auVar205,auVar70);
              auVar70 = maxps(auVar17,auVar15);
              auVar70 = maxps(auVar226,auVar70);
              auVar145._0_8_ = auVar205._0_8_ & 0x7fffffff7fffffff;
              auVar145._8_4_ = auVar205._8_4_ & 0x7fffffff;
              auVar145._12_4_ = auVar205._12_4_ & 0x7fffffff;
              local_508 = auVar70._12_4_;
              auVar89._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
              auVar89._8_4_ = auVar70._8_4_ & 0x7fffffff;
              auVar89._12_4_ = ABS(local_508);
              auVar70 = maxps(auVar145,auVar89);
              fVar99 = auVar70._4_4_;
              if (auVar70._4_4_ <= auVar70._0_4_) {
                fVar99 = auVar70._0_4_;
              }
              auVar146._8_8_ = auVar70._8_8_;
              auVar146._0_8_ = auVar70._8_8_;
              if (auVar70._8_4_ <= fVar99) {
                auVar146._0_4_ = fVar99;
              }
              register0x00001284 = auVar146._4_12_;
              local_498._0_4_ = auVar146._0_4_ * 1.9073486e-06;
              fStack_504 = local_508;
              fStack_500 = local_508;
              fStack_4fc = local_508;
              fVar99 = *(float *)(local_108 + uVar44 * 4);
              fVar139 = *(float *)(local_138 + uVar44 * 4);
              lVar54 = 5;
              do {
                fVar230 = SQRT(fVar62) * 1.9073486e-06 * fVar139;
                fVar168 = 1.0 - fVar99;
                fVar169 = local_428 * fVar168 + local_438 * fVar99;
                fVar196 = fStack_424 * fVar168 + fStack_434 * fVar99;
                fVar197 = fStack_420 * fVar168 + fStack_430 * fVar99;
                fVar210 = fStack_41c * fVar168 + fStack_42c * fVar99;
                fVar237 = (fVar100 * fVar168 + local_428 * fVar99) * fVar168 + fVar99 * fVar169;
                fVar243 = (fVar101 * fVar168 + fStack_424 * fVar99) * fVar168 + fVar99 * fVar196;
                fVar244 = (fVar102 * fVar168 + fStack_420 * fVar99) * fVar168 + fVar99 * fVar197;
                fVar170 = (fVar103 * fVar168 + fStack_41c * fVar99) * fVar168 + fVar99 * fVar210;
                fVar250 = fVar169 * fVar168 + (local_438 * fVar168 + local_448 * fVar99) * fVar99;
                fVar252 = fVar196 * fVar168 + (fStack_434 * fVar168 + fStack_444 * fVar99) * fVar99;
                fVar260 = fVar197 * fVar168 + (fStack_430 * fVar168 + fStack_440 * fVar99) * fVar99;
                fVar210 = fVar210 * fVar168 + (fStack_42c * fVar168 + fStack_43c * fVar99) * fVar99;
                fVar249 = fVar168 * fVar170 + fVar99 * fVar210;
                fVar169 = (fVar250 - fVar237) * 3.0;
                fVar196 = (fVar252 - fVar243) * 3.0;
                fVar197 = (fVar260 - fVar244) * 3.0;
                fVar170 = (fVar210 - fVar170) * 3.0;
                fVar210 = fVar168 * 6.0;
                fVar238 = (fVar99 - (fVar168 + fVar168)) * 6.0;
                fVar245 = (fVar168 - (fVar99 + fVar99)) * 6.0;
                fVar236 = fVar99 * 6.0;
                fVar228 = fVar210 * fVar100 +
                          fVar238 * local_428 + fVar245 * local_438 + fVar236 * local_448;
                fVar229 = fVar210 * fVar101 +
                          fVar238 * fStack_424 + fVar245 * fStack_434 + fVar236 * fStack_444;
                fVar210 = fVar210 * fVar102 +
                          fVar238 * fStack_420 + fVar245 * fStack_430 + fVar236 * fStack_440;
                local_4b8._0_4_ =
                     (fVar139 * (float)local_528._0_4_ + 0.0) -
                     (fVar168 * fVar237 + fVar99 * fVar250);
                local_4b8._4_4_ =
                     (fVar139 * (float)local_528._4_4_ + 0.0) -
                     (fVar168 * fVar243 + fVar99 * fVar252);
                fStack_4b0 = (fVar139 * fStack_520 + 0.0) - (fVar168 * fVar244 + fVar99 * fVar260);
                fStack_4ac = (fVar139 * fStack_51c + 0.0) - fVar249;
                fVar168 = (float)local_4b8._4_4_ * (float)local_4b8._4_4_;
                fStack_4a0 = fStack_4b0 * fStack_4b0;
                fStack_49c = fStack_4ac * fStack_4ac;
                local_4a8._0_4_ =
                     fVar168 + (float)local_4b8._0_4_ * (float)local_4b8._0_4_ + fStack_4a0;
                local_4a8._4_4_ = fVar168 + fVar168 + fStack_49c;
                fStack_4a0 = fVar168 + fStack_4a0 + fStack_4a0;
                fStack_49c = fVar168 + fStack_49c + fStack_49c;
                fVar168 = (float)local_498._0_4_;
                if ((float)local_498._0_4_ <= fVar230) {
                  fVar168 = fVar230;
                }
                fVar237 = fVar196 * fVar196 + fVar169 * fVar169 + fVar197 * fVar197;
                auVar70 = ZEXT416((uint)fVar237);
                auVar205 = rsqrtss(ZEXT416((uint)fVar237),auVar70);
                fVar230 = auVar205._0_4_;
                fVar238 = fVar230 * 1.5 - fVar230 * fVar230 * fVar237 * 0.5 * fVar230;
                fVar262 = fVar169 * fVar238;
                fVar264 = fVar196 * fVar238;
                fVar266 = fVar197 * fVar238;
                fVar270 = fVar170 * fVar238;
                fVar252 = fVar197 * fVar210 + fVar196 * fVar229 + fVar169 * fVar228;
                auVar70 = rcpss(auVar70,auVar70);
                fVar236 = (2.0 - fVar237 * auVar70._0_4_) * auVar70._0_4_;
                fVar230 = (float)local_4b8._4_4_ * fVar264;
                fVar243 = fStack_4b0 * fVar266;
                fVar244 = fStack_4ac * fVar270;
                fVar245 = fVar230 + (float)local_4b8._0_4_ * fVar262 + fVar243;
                fVar250 = fVar230 + fVar230 + fVar244;
                fVar243 = fVar230 + fVar243 + fVar243;
                fVar244 = fVar230 + fVar244 + fVar244;
                fVar260 = (SQRT((float)local_4a8._0_4_) + 1.0) *
                          ((float)local_498._0_4_ / SQRT(fVar237)) +
                          SQRT((float)local_4a8._0_4_) * (float)local_498._0_4_ + fVar168;
                fVar230 = fStack_51c * fVar270;
                fVar270 = fVar270 * -fVar170;
                fVar238 = fVar266 * -fVar197 + fVar264 * -fVar196 + fVar262 * -fVar169 +
                          fVar236 * (fVar237 * fVar210 - fVar252 * fVar197) * fVar238 * fStack_4b0 +
                          fVar236 * (fVar237 * fVar229 - fVar252 * fVar196) * fVar238 *
                          (float)local_4b8._4_4_ +
                          fVar236 * (fVar237 * fVar228 - fVar252 * fVar169) * fVar238 *
                          (float)local_4b8._0_4_;
                fVar210 = fStack_520 * fVar266 +
                          (float)local_528._4_4_ * fVar264 + (float)local_528._0_4_ * fVar262;
                fVar236 = (float)local_4a8._0_4_ - fVar245 * fVar245;
                auVar268._0_8_ = CONCAT44((float)local_4a8._4_4_ - fVar250 * fVar250,fVar236);
                auVar268._8_4_ = fStack_4a0 - fVar243 * fVar243;
                auVar268._12_4_ = fStack_49c - fVar244 * fVar244;
                fStack_530 = -fVar197 * fStack_4b0;
                fStack_534 = -fVar170 * fStack_4ac;
                local_608 = CONCAT44(fVar270,fVar238);
                local_538 = (fStack_530 +
                            -fVar196 * (float)local_4b8._4_4_ + -fVar169 * (float)local_4b8._0_4_) -
                            fVar245 * fVar238;
                fStack_52c = fStack_534;
                fVar229 = fStack_51c * fStack_4ac;
                fVar228 = (fStack_520 * fStack_4b0 +
                          (float)local_528._4_4_ * (float)local_4b8._4_4_ +
                          (float)local_528._0_4_ * (float)local_4b8._0_4_) - fVar245 * fVar210;
                auVar124._8_4_ = auVar268._8_4_;
                auVar124._0_8_ = auVar268._0_8_;
                auVar124._12_4_ = auVar268._12_4_;
                auVar70 = rsqrtss(auVar124,auVar268);
                fVar237 = auVar70._0_4_;
                auVar162._0_4_ = fVar237 * 1.5 - fVar237 * fVar237 * fVar236 * 0.5 * fVar237;
                auVar162._4_12_ = auVar70._4_12_;
                if (fVar236 < 0.0) {
                  _local_4f8 = auVar162;
                  local_4e8 = fVar228;
                  fStack_4e4 = fVar229;
                  fStack_4e0 = fStack_520 * fStack_4b0;
                  fStack_4dc = fVar229;
                  local_4d8 = fVar210;
                  fStack_4d4 = fVar230;
                  fStack_4d0 = fStack_520 * fVar266;
                  fStack_4cc = fVar230;
                  local_4c8 = fVar169;
                  fStack_4c4 = fVar196;
                  fStack_4c0 = fVar197;
                  fStack_4bc = fVar170;
                  fVar236 = sqrtf(fVar236);
                  uVar44 = extraout_RAX;
                  auVar162 = _local_4f8;
                  fVar210 = local_4d8;
                  fVar230 = fStack_4d4;
                  fVar228 = local_4e8;
                  fVar229 = fStack_4e4;
                  fVar169 = local_4c8;
                  fVar196 = fStack_4c4;
                  fVar197 = fStack_4c0;
                  fVar170 = fStack_4bc;
                }
                else {
                  fVar236 = SQRT(fVar236);
                }
                fVar236 = fVar236 - fVar249;
                fVar237 = local_538 * auVar162._0_4_ - fVar170;
                fVar228 = fVar228 * auVar162._0_4_;
                auVar163._0_4_ = fVar238 * fVar228 - fVar210 * fVar237;
                auVar176._8_4_ = -fStack_534;
                auVar176._0_8_ = CONCAT44(fStack_534,fVar237) ^ 0x8000000000000000;
                auVar176._12_4_ = fVar229;
                auVar175._8_8_ = auVar176._8_8_;
                auVar175._0_8_ = CONCAT44(fVar228,fVar237) ^ 0x80000000;
                auVar163._4_4_ = auVar163._0_4_;
                auVar163._8_4_ = auVar163._0_4_;
                auVar163._12_4_ = auVar163._0_4_;
                auVar70 = divps(auVar175,auVar163);
                auVar192._8_4_ = fVar270;
                auVar192._0_8_ = local_608;
                auVar192._12_4_ = -fVar230;
                auVar191._8_8_ = auVar192._8_8_;
                auVar191._0_8_ = CONCAT44(fVar210,fVar238) ^ 0x8000000000000000;
                auVar205 = divps(auVar191,auVar163);
                fVar139 = fVar139 - (fVar236 * auVar205._0_4_ + fVar245 * auVar70._0_4_);
                fVar99 = fVar99 - (fVar236 * auVar205._4_4_ + fVar245 * auVar70._4_4_);
                if ((ABS(fVar245) < fVar260) &&
                   (ABS(fVar236) < local_508 * 1.9073486e-06 + fVar168 + fVar260)) {
                  fVar139 = (float)local_3e8._0_4_ + fVar139;
                  if ((fVar155 <= fVar139) &&
                     (((fVar168 = *(float *)(ray + k * 4 + 0x80), fVar139 <= fVar168 &&
                       (0.0 <= fVar99)) && (fVar99 <= 1.0)))) {
                    auVar70 = rsqrtss(_local_4a8,_local_4a8);
                    fVar210 = auVar70._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar55].ptr;
                    uVar44 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar229 = fVar210 * 1.5 + fVar210 * fVar210 * local_4a8._0_4_ * -0.5 * fVar210
                      ;
                      fVar230 = (float)local_4b8._0_4_ * fVar229;
                      fVar237 = (float)local_4b8._4_4_ * fVar229;
                      fVar229 = fStack_4b0 * fVar229;
                      fVar210 = fVar170 * fVar230 + fVar169;
                      fVar228 = fVar170 * fVar237 + fVar196;
                      fVar170 = fVar170 * fVar229 + fVar197;
                      fVar236 = fVar237 * fVar169 - fVar196 * fVar230;
                      fVar237 = fVar229 * fVar196 - fVar197 * fVar237;
                      fVar196 = fVar230 * fVar197 - fVar169 * fVar229;
                      fVar169 = fVar228 * fVar237 - fVar196 * fVar210;
                      fVar196 = fVar170 * fVar196 - fVar236 * fVar228;
                      fVar197 = fVar210 * fVar236 - fVar237 * fVar170;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar139;
                        *(float *)(ray + k * 4 + 0xc0) = fVar196;
                        *(float *)(ray + k * 4 + 0xd0) = fVar197;
                        *(float *)(ray + k * 4 + 0xe0) = fVar169;
                        *(float *)(ray + k * 4 + 0xf0) = fVar99;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_5a0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar55;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar56 = context->user->instPrimID[0];
                        uVar44 = (ulong)uVar56;
                        *(uint *)(ray + k * 4 + 0x140) = uVar56;
                      }
                      else {
                        local_378._4_4_ = fVar196;
                        local_378._0_4_ = fVar196;
                        fStack_370 = fVar196;
                        fStack_36c = fVar196;
                        local_368 = fVar197;
                        fStack_364 = fVar197;
                        fStack_360 = fVar197;
                        fStack_35c = fVar197;
                        local_358 = fVar169;
                        fStack_354 = fVar169;
                        fStack_350 = fVar169;
                        fStack_34c = fVar169;
                        local_348 = fVar99;
                        fStack_344 = fVar99;
                        fStack_340 = fVar99;
                        fStack_33c = fVar99;
                        local_338 = 0;
                        uStack_330 = 0;
                        local_328 = CONCAT44(uStack_3b4,local_3b8);
                        uStack_320 = CONCAT44(uStack_3ac,uStack_3b0);
                        local_318 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_310 = CONCAT44(uStack_39c,uStack_3a0);
                        local_308 = context->user->instID[0];
                        uStack_304 = local_308;
                        uStack_300 = local_308;
                        uStack_2fc = local_308;
                        local_2f8 = context->user->instPrimID[0];
                        uStack_2f4 = local_2f8;
                        uStack_2f0 = local_2f8;
                        uStack_2ec = local_2f8;
                        *(float *)(ray + k * 4 + 0x80) = fVar139;
                        local_5b8 = *local_488;
                        _local_598 = (int *)local_5b8;
                        uStack_590 = pGVar8->userPtr;
                        local_588 = context->user;
                        local_580 = ray;
                        local_578 = (RTCHitN *)local_378;
                        local_570 = 4;
                        p_Var46 = pGVar8->intersectionFilterN;
                        if (p_Var46 != (RTCFilterFunctionN)0x0) {
                          p_Var46 = (RTCFilterFunctionN)
                                    (*p_Var46)((RTCFilterFunctionNArguments *)local_598);
                        }
                        auVar125._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                        auVar125._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                        auVar125._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                        auVar125._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                        uVar56 = movmskps((int)p_Var46,auVar125);
                        pRVar45 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                        if ((uVar56 ^ 0xf) == 0) {
                          auVar125 = auVar125 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var46 = context->args->filter;
                          if ((p_Var46 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            p_Var46 = (RTCFilterFunctionN)
                                      (*p_Var46)((RTCFilterFunctionNArguments *)local_598);
                          }
                          auVar90._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                          auVar90._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                          auVar90._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                          auVar90._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                          auVar125 = auVar90 ^ _DAT_01f7ae20;
                          uVar56 = movmskps((int)p_Var46,auVar90);
                          pRVar45 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                          if ((uVar56 ^ 0xf) != 0) {
                            uVar56 = *(uint *)(local_578 + 4);
                            uVar57 = *(uint *)(local_578 + 8);
                            uVar58 = *(uint *)(local_578 + 0xc);
                            *(uint *)(local_580 + 0xc0) =
                                 ~auVar90._0_4_ & *(uint *)local_578 |
                                 *(uint *)(local_580 + 0xc0) & auVar90._0_4_;
                            *(uint *)(local_580 + 0xc4) =
                                 ~auVar90._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xc4) & auVar90._4_4_;
                            *(uint *)(local_580 + 200) =
                                 ~auVar90._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 200) & auVar90._8_4_;
                            *(uint *)(local_580 + 0xcc) =
                                 ~auVar90._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xcc) & auVar90._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x14);
                            uVar57 = *(uint *)(local_578 + 0x18);
                            uVar58 = *(uint *)(local_578 + 0x1c);
                            *(uint *)(local_580 + 0xd0) =
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x10) |
                                 *(uint *)(local_580 + 0xd0) & auVar90._0_4_;
                            *(uint *)(local_580 + 0xd4) =
                                 ~auVar90._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xd4) & auVar90._4_4_;
                            *(uint *)(local_580 + 0xd8) =
                                 ~auVar90._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0xd8) & auVar90._8_4_;
                            *(uint *)(local_580 + 0xdc) =
                                 ~auVar90._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xdc) & auVar90._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x24);
                            uVar57 = *(uint *)(local_578 + 0x28);
                            uVar58 = *(uint *)(local_578 + 0x2c);
                            *(uint *)(local_580 + 0xe0) =
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x20) |
                                 *(uint *)(local_580 + 0xe0) & auVar90._0_4_;
                            *(uint *)(local_580 + 0xe4) =
                                 ~auVar90._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xe4) & auVar90._4_4_;
                            *(uint *)(local_580 + 0xe8) =
                                 ~auVar90._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0xe8) & auVar90._8_4_;
                            *(uint *)(local_580 + 0xec) =
                                 ~auVar90._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xec) & auVar90._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x34);
                            uVar57 = *(uint *)(local_578 + 0x38);
                            uVar58 = *(uint *)(local_578 + 0x3c);
                            *(uint *)(local_580 + 0xf0) =
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x30) |
                                 *(uint *)(local_580 + 0xf0) & auVar90._0_4_;
                            *(uint *)(local_580 + 0xf4) =
                                 ~auVar90._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xf4) & auVar90._4_4_;
                            *(uint *)(local_580 + 0xf8) =
                                 ~auVar90._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0xf8) & auVar90._8_4_;
                            *(uint *)(local_580 + 0xfc) =
                                 ~auVar90._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xfc) & auVar90._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x44);
                            uVar57 = *(uint *)(local_578 + 0x48);
                            uVar58 = *(uint *)(local_578 + 0x4c);
                            *(uint *)(local_580 + 0x100) =
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x40) |
                                 *(uint *)(local_580 + 0x100) & auVar90._0_4_;
                            *(uint *)(local_580 + 0x104) =
                                 ~auVar90._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0x104) & auVar90._4_4_;
                            *(uint *)(local_580 + 0x108) =
                                 ~auVar90._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0x108) & auVar90._8_4_;
                            *(uint *)(local_580 + 0x10c) =
                                 ~auVar90._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0x10c) & auVar90._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x54);
                            uVar57 = *(uint *)(local_578 + 0x58);
                            uVar58 = *(uint *)(local_578 + 0x5c);
                            *(uint *)(local_580 + 0x110) =
                                 *(uint *)(local_580 + 0x110) & auVar90._0_4_ |
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x50);
                            *(uint *)(local_580 + 0x114) =
                                 *(uint *)(local_580 + 0x114) & auVar90._4_4_ |
                                 ~auVar90._4_4_ & uVar56;
                            *(uint *)(local_580 + 0x118) =
                                 *(uint *)(local_580 + 0x118) & auVar90._8_4_ |
                                 ~auVar90._8_4_ & uVar57;
                            *(uint *)(local_580 + 0x11c) =
                                 *(uint *)(local_580 + 0x11c) & auVar90._12_4_ |
                                 ~auVar90._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_578 + 100);
                            uVar57 = *(uint *)(local_578 + 0x68);
                            uVar58 = *(uint *)(local_578 + 0x6c);
                            *(uint *)(local_580 + 0x120) =
                                 *(uint *)(local_580 + 0x120) & auVar90._0_4_ |
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x60);
                            *(uint *)(local_580 + 0x124) =
                                 *(uint *)(local_580 + 0x124) & auVar90._4_4_ |
                                 ~auVar90._4_4_ & uVar56;
                            *(uint *)(local_580 + 0x128) =
                                 *(uint *)(local_580 + 0x128) & auVar90._8_4_ |
                                 ~auVar90._8_4_ & uVar57;
                            *(uint *)(local_580 + 300) =
                                 *(uint *)(local_580 + 300) & auVar90._12_4_ |
                                 ~auVar90._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_578 + 0x74);
                            uVar57 = *(uint *)(local_578 + 0x78);
                            uVar58 = *(uint *)(local_578 + 0x7c);
                            *(uint *)(local_580 + 0x130) =
                                 ~auVar90._0_4_ & *(uint *)(local_578 + 0x70) |
                                 *(uint *)(local_580 + 0x130) & auVar90._0_4_;
                            *(uint *)(local_580 + 0x134) =
                                 ~auVar90._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0x134) & auVar90._4_4_;
                            *(uint *)(local_580 + 0x138) =
                                 ~auVar90._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0x138) & auVar90._8_4_;
                            *(uint *)(local_580 + 0x13c) =
                                 ~auVar90._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0x13c) & auVar90._12_4_;
                            *(undefined1 (*) [16])(local_580 + 0x140) =
                                 ~auVar90 & *(undefined1 (*) [16])(local_578 + 0x80) |
                                 *(undefined1 (*) [16])(local_580 + 0x140) & auVar90;
                            pRVar45 = local_580;
                          }
                        }
                        auVar126._0_4_ = auVar125._0_4_ << 0x1f;
                        auVar126._4_4_ = auVar125._4_4_ << 0x1f;
                        auVar126._8_4_ = auVar125._8_4_ << 0x1f;
                        auVar126._12_4_ = auVar125._12_4_ << 0x1f;
                        iVar42 = movmskps((int)pRVar45,auVar126);
                        uVar44 = CONCAT44((int)((ulong)pRVar45 >> 0x20),iVar42);
                        if (iVar42 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar168;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar54 = lVar54 + -1;
              } while (lVar54 != 0);
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_548 <= fVar170) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_544 <= fVar170) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_540 <= fVar170) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_53c <= fVar170) & local_3c8._12_4_;
              uVar48 = (undefined4)(uVar44 >> 0x20);
              iVar42 = movmskps((int)uVar44,local_3c8);
              prim = local_480;
            } while (iVar42 != 0);
          }
          auVar128._0_4_ = -(uint)(auVar186._0_4_ + local_558 <= fVar170) & local_408._0_4_;
          auVar128._4_4_ = -(uint)(auVar186._4_4_ + fStack_554 <= fVar170) & local_408._4_4_;
          auVar128._8_4_ = -(uint)(auVar186._8_4_ + fStack_550 <= fVar170) & (uint)fStack_400;
          auVar128._12_4_ = -(uint)(auVar186._12_4_ + fStack_54c <= fVar170) & (uint)fStack_3fc;
          auVar149._0_4_ =
               -(uint)((int)local_418 <
                      ((int)((-(uint)(0.3 <= ABS(fVar137 + fVar180 * (float)local_628._4_4_ +
                                                           fVar138 * fVar61)) & local_518._0_4_) <<
                            0x1f) >> 0x1f) + 4);
          auVar149._4_4_ =
               -(uint)((int)fStack_414 <
                      ((int)((-(uint)(0.3 <= ABS(fVar154 + fVar181 * (float)local_628._4_4_ +
                                                           fVar156 * fVar61)) & local_518._4_4_) <<
                            0x1f) >> 0x1f) + 4);
          auVar149._8_4_ =
               -(uint)((int)fStack_410 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_630 +
                                                 fVar208 * (float)local_628._4_4_ + fVar182 * fVar61
                                                )) & (uint)fStack_510) << 0x1f) >> 0x1f) + 4);
          auVar149._12_4_ =
               -(uint)((int)fStack_40c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_62c +
                                                 fVar209 * (float)local_628._4_4_ + fVar198 * fVar61
                                                )) & (uint)fStack_50c) << 0x1f) >> 0x1f) + 4);
          local_3d8 = ~auVar149 & auVar128;
          iVar42 = movmskps(0,local_3d8);
          if (iVar42 != 0) {
            fVar99 = local_2e8._0_4_;
            fVar137 = local_2e8._4_4_;
            fVar138 = local_2e8._8_4_;
            fVar139 = local_2e8._12_4_;
            local_548 = local_558 + fVar99;
            fStack_544 = fStack_554 + fVar137;
            fStack_540 = fStack_550 + fVar138;
            fStack_53c = fStack_54c + fVar139;
            do {
              uVar56 = local_3d8._0_4_;
              uVar57 = local_3d8._4_4_;
              uVar58 = local_3d8._8_4_;
              uVar59 = local_3d8._12_4_;
              auVar129._0_4_ = uVar56 & (uint)fVar99;
              auVar129._4_4_ = uVar57 & (uint)fVar137;
              auVar129._8_4_ = uVar58 & (uint)fVar138;
              auVar129._12_4_ = uVar59 & (uint)fVar139;
              auVar150._0_8_ = CONCAT44(~uVar57,~uVar56) & 0x7f8000007f800000;
              auVar150._8_4_ = ~uVar58 & 0x7f800000;
              auVar150._12_4_ = ~uVar59 & 0x7f800000;
              auVar150 = auVar150 | auVar129;
              auVar165._4_4_ = auVar150._0_4_;
              auVar165._0_4_ = auVar150._4_4_;
              auVar165._8_4_ = auVar150._12_4_;
              auVar165._12_4_ = auVar150._8_4_;
              auVar70 = minps(auVar165,auVar150);
              auVar130._0_8_ = auVar70._8_8_;
              auVar130._8_4_ = auVar70._0_4_;
              auVar130._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar130,auVar70);
              auVar131._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar150._4_4_) & uVar57,
                            -(uint)(auVar70._0_4_ == auVar150._0_4_) & uVar56);
              auVar131._8_4_ = -(uint)(auVar70._8_4_ == auVar150._8_4_) & uVar58;
              auVar131._12_4_ = -(uint)(auVar70._12_4_ == auVar150._12_4_) & uVar59;
              iVar42 = movmskps(iVar42,auVar131);
              auVar93 = local_3d8;
              if (iVar42 != 0) {
                auVar93._8_4_ = auVar131._8_4_;
                auVar93._0_8_ = auVar131._0_8_;
                auVar93._12_4_ = auVar131._12_4_;
              }
              uVar43 = movmskps(iVar42,auVar93);
              uVar44 = 0;
              if (CONCAT44(uVar48,uVar43) != 0) {
                for (; (CONCAT44(uVar48,uVar43) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              *(undefined4 *)(local_3d8 + uVar44 * 4) = 0;
              auVar20._4_4_ = fStack_424;
              auVar20._0_4_ = local_428;
              auVar20._8_4_ = fStack_420;
              auVar20._12_4_ = fStack_41c;
              auVar185 = minps(auVar248,auVar20);
              auVar186 = maxps(auVar248,auVar20);
              auVar18._4_4_ = fStack_434;
              auVar18._0_4_ = local_438;
              auVar18._8_4_ = fStack_430;
              auVar18._12_4_ = fStack_42c;
              auVar16._4_4_ = fStack_444;
              auVar16._0_4_ = local_448;
              auVar16._8_4_ = fStack_440;
              auVar16._12_4_ = fStack_43c;
              auVar70 = minps(auVar18,auVar16);
              auVar185 = minps(auVar185,auVar70);
              auVar70 = maxps(auVar18,auVar16);
              auVar70 = maxps(auVar186,auVar70);
              auVar151._0_8_ = auVar185._0_8_ & 0x7fffffff7fffffff;
              auVar151._8_4_ = auVar185._8_4_ & 0x7fffffff;
              auVar151._12_4_ = auVar185._12_4_ & 0x7fffffff;
              local_508 = auVar70._12_4_;
              auVar94._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
              auVar94._8_4_ = auVar70._8_4_ & 0x7fffffff;
              auVar94._12_4_ = ABS(local_508);
              auVar70 = maxps(auVar151,auVar94);
              fVar154 = auVar70._4_4_;
              if (auVar70._4_4_ <= auVar70._0_4_) {
                fVar154 = auVar70._0_4_;
              }
              auVar152._8_8_ = auVar70._8_8_;
              auVar152._0_8_ = auVar70._8_8_;
              if (auVar70._8_4_ <= fVar154) {
                auVar152._0_4_ = fVar154;
              }
              fVar168 = auVar152._0_4_ * 1.9073486e-06;
              fStack_504 = local_508;
              fStack_500 = local_508;
              fStack_4fc = local_508;
              fVar154 = local_118[uVar44];
              fVar156 = *(float *)(local_2d8 + uVar44 * 4);
              lVar54 = 5;
              do {
                fVar198 = SQRT(fVar62) * 1.9073486e-06 * fVar156;
                fVar169 = 1.0 - fVar154;
                fVar196 = local_428 * fVar169 + local_438 * fVar154;
                fVar197 = fStack_424 * fVar169 + fStack_434 * fVar154;
                fVar170 = fStack_420 * fVar169 + fStack_430 * fVar154;
                fVar181 = fStack_41c * fVar169 + fStack_42c * fVar154;
                fVar180 = (auVar248._0_4_ * fVar169 + local_428 * fVar154) * fVar169 +
                          fVar154 * fVar196;
                fVar208 = (auVar248._4_4_ * fVar169 + fStack_424 * fVar154) * fVar169 +
                          fVar154 * fVar197;
                fVar209 = (auVar248._8_4_ * fVar169 + fStack_420 * fVar154) * fVar169 +
                          fVar154 * fVar170;
                fVar182 = (auVar248._12_4_ * fVar169 + fStack_41c * fVar154) * fVar169 +
                          fVar154 * fVar181;
                fVar229 = fVar196 * fVar169 + (local_438 * fVar169 + local_448 * fVar154) * fVar154;
                fVar236 = fVar197 * fVar169 +
                          (fStack_434 * fVar169 + fStack_444 * fVar154) * fVar154;
                fVar238 = fVar170 * fVar169 +
                          (fStack_430 * fVar169 + fStack_440 * fVar154) * fVar154;
                fVar196 = fVar181 * fVar169 +
                          (fStack_42c * fVar169 + fStack_43c * fVar154) * fVar154;
                fVar228 = fVar169 * fVar182 + fVar154 * fVar196;
                fVar230 = (fVar229 - fVar180) * 3.0;
                fVar237 = (fVar236 - fVar208) * 3.0;
                fVar243 = (fVar238 - fVar209) * 3.0;
                fVar244 = (fVar196 - fVar182) * 3.0;
                fVar182 = fVar169 * 6.0;
                fVar181 = (fVar154 - (fVar169 + fVar169)) * 6.0;
                fVar210 = (fVar169 - (fVar154 + fVar154)) * 6.0;
                fVar170 = fVar154 * 6.0;
                fVar196 = fVar182 * auVar248._0_4_ +
                          fVar181 * local_428 + fVar210 * local_438 + fVar170 * local_448;
                fVar197 = fVar182 * auVar248._4_4_ +
                          fVar181 * fStack_424 + fVar210 * fStack_434 + fVar170 * fStack_444;
                fVar182 = fVar182 * auVar248._8_4_ +
                          fVar181 * fStack_420 + fVar210 * fStack_430 + fVar170 * fStack_440;
                fVar170 = (fVar156 * (float)local_528._0_4_ + 0.0) -
                          (fVar169 * fVar180 + fVar154 * fVar229);
                fVar180 = (fVar156 * (float)local_528._4_4_ + 0.0) -
                          (fVar169 * fVar208 + fVar154 * fVar236);
                fVar181 = (fVar156 * fStack_520 + 0.0) - (fVar169 * fVar209 + fVar154 * fVar238);
                fStack_49c = (fVar156 * fStack_51c + 0.0) - fVar228;
                fVar169 = fVar180 * fVar180;
                fStack_490 = fVar181 * fVar181;
                fStack_48c = fStack_49c * fStack_49c;
                local_498._0_4_ = fVar169 + fVar170 * fVar170 + fStack_490;
                local_498._4_4_ = fVar169 + fVar169 + fStack_48c;
                fStack_490 = fVar169 + fStack_490 + fStack_490;
                fStack_48c = fVar169 + fStack_48c + fStack_48c;
                uStack_5d4 = auVar152._4_4_;
                uStack_5d0 = auVar152._8_4_;
                uStack_5cc = auVar152._12_4_;
                fVar169 = fVar168;
                if (fVar168 <= fVar198) {
                  fVar169 = fVar198;
                }
                fVar209 = fVar237 * fVar237 + fVar230 * fVar230 + fVar243 * fVar243;
                auVar70 = ZEXT416((uint)fVar209);
                auVar185 = rsqrtss(ZEXT416((uint)fVar209),auVar70);
                fVar198 = auVar185._0_4_;
                fVar210 = fVar198 * 1.5 - fVar198 * fVar198 * fVar209 * 0.5 * fVar198;
                fVar245 = fVar230 * fVar210;
                fVar249 = fVar237 * fVar210;
                fVar250 = fVar243 * fVar210;
                fVar252 = fVar244 * fVar210;
                fVar238 = fVar243 * fVar182 + fVar237 * fVar197 + fVar230 * fVar196;
                auVar70 = rcpss(auVar70,auVar70);
                fVar208 = (2.0 - fVar209 * auVar70._0_4_) * auVar70._0_4_;
                fVar198 = fVar180 * fVar249;
                fVar229 = fVar181 * fVar250;
                fVar236 = fStack_49c * fVar252;
                fVar260 = fVar198 + fVar170 * fVar245 + fVar229;
                fVar262 = fVar198 + fVar198 + fVar236;
                fVar229 = fVar198 + fVar229 + fVar229;
                fVar236 = fVar198 + fVar236 + fVar236;
                local_538 = (SQRT((float)local_498._0_4_) + 1.0) * (fVar168 / SQRT(fVar209)) +
                            SQRT((float)local_498._0_4_) * fVar168 + fVar169;
                fVar198 = fStack_51c * fVar252;
                fVar252 = fVar252 * -fVar244;
                fVar238 = fVar250 * -fVar243 + fVar249 * -fVar237 + fVar245 * -fVar230 +
                          fVar208 * (fVar209 * fVar182 - fVar238 * fVar243) * fVar210 * fVar181 +
                          fVar208 * (fVar209 * fVar197 - fVar238 * fVar237) * fVar210 * fVar180 +
                          fVar208 * (fVar209 * fVar196 - fVar238 * fVar230) * fVar210 * fVar170;
                fVar197 = fStack_520 * fVar250 +
                          (float)local_528._4_4_ * fVar249 + (float)local_528._0_4_ * fVar245;
                fVar208 = (float)local_498._0_4_ - fVar260 * fVar260;
                auVar95._0_8_ = CONCAT44((float)local_498._4_4_ - fVar262 * fVar262,fVar208);
                auVar95._8_4_ = fStack_490 - fVar229 * fVar229;
                auVar95._12_4_ = fStack_48c - fVar236 * fVar236;
                fVar210 = -fVar244 * fStack_49c;
                local_5c8 = CONCAT44(fVar252,fVar238);
                local_4a8._4_4_ = fVar180;
                local_4a8._0_4_ = fVar170;
                fStack_4a0 = fVar181;
                fVar196 = fStack_51c * fStack_49c;
                fVar182 = (fStack_520 * fVar181 +
                          (float)local_528._4_4_ * fVar180 + (float)local_528._0_4_ * fVar170) -
                          fVar260 * fVar197;
                auVar132._8_4_ = auVar95._8_4_;
                auVar132._0_8_ = auVar95._0_8_;
                auVar132._12_4_ = auVar95._12_4_;
                auVar70 = rsqrtss(auVar132,auVar95);
                fVar209 = auVar70._0_4_;
                auVar166._0_4_ = fVar209 * 1.5 - fVar209 * fVar209 * fVar208 * 0.5 * fVar209;
                auVar166._4_12_ = auVar70._4_12_;
                if (fVar208 < 0.0) {
                  local_4b8._4_4_ = uStack_5d4;
                  local_4b8._0_4_ = fVar169;
                  fStack_4b0 = (float)uStack_5d0;
                  fStack_4ac = (float)uStack_5cc;
                  _local_4f8 = auVar166;
                  local_4e8 = fVar182;
                  fStack_4e4 = fVar196;
                  fStack_4e0 = fStack_520 * fVar181;
                  fStack_4dc = fVar196;
                  local_4d8 = fVar197;
                  fStack_4d4 = fVar198;
                  fStack_4d0 = fStack_520 * fVar250;
                  fStack_4cc = fVar198;
                  local_4c8 = fVar260;
                  fStack_4c4 = fVar262;
                  fStack_4c0 = fVar229;
                  fStack_4bc = fVar236;
                  fVar208 = sqrtf(fVar208);
                  uVar44 = extraout_RAX_00;
                  auVar166 = _local_4f8;
                  fVar169 = (float)local_4b8._0_4_;
                  fVar182 = local_4e8;
                  fVar196 = fStack_4e4;
                  fVar209 = local_4c8;
                  fVar197 = local_4d8;
                  fVar198 = fStack_4d4;
                }
                else {
                  fVar208 = SQRT(fVar208);
                  fVar209 = fVar260;
                }
                fVar208 = fVar208 - fVar228;
                fVar170 = ((-fVar243 * fVar181 + -fVar237 * fVar180 + -fVar230 * fVar170) -
                          fVar260 * fVar238) * auVar166._0_4_ - fVar244;
                fVar182 = fVar182 * auVar166._0_4_;
                auVar178._0_8_ = CONCAT44(fVar210,fVar170) ^ 0x8000000080000000;
                auVar167._0_4_ = fVar238 * fVar182 - fVar197 * fVar170;
                auVar178._8_4_ = -fVar210;
                auVar178._12_4_ = fVar196;
                auVar177._8_8_ = auVar178._8_8_;
                auVar177._0_8_ = CONCAT44(fVar182,fVar170) ^ 0x80000000;
                auVar167._4_4_ = auVar167._0_4_;
                auVar167._8_4_ = auVar167._0_4_;
                auVar167._12_4_ = auVar167._0_4_;
                auVar70 = divps(auVar177,auVar167);
                auVar194._8_4_ = fVar252;
                auVar194._0_8_ = local_5c8;
                auVar194._12_4_ = -fVar198;
                auVar193._8_8_ = auVar194._8_8_;
                auVar193._0_8_ = CONCAT44(fVar197,fVar238) ^ 0x8000000000000000;
                auVar185 = divps(auVar193,auVar167);
                fVar156 = fVar156 - (fVar208 * auVar185._0_4_ + fVar209 * auVar70._0_4_);
                fVar154 = fVar154 - (fVar208 * auVar185._4_4_ + fVar209 * auVar70._4_4_);
                if ((ABS(fVar209) < local_538) &&
                   (ABS(fVar208) < local_508 * 1.9073486e-06 + fVar169 + local_538)) {
                  fVar156 = (float)local_3e8._0_4_ + fVar156;
                  if ((fVar155 <= fVar156) &&
                     (((fVar168 = *(float *)(ray + k * 4 + 0x80), fVar156 <= fVar168 &&
                       (0.0 <= fVar154)) && (fVar154 <= 1.0)))) {
                    auVar70 = rsqrtss(_local_498,_local_498);
                    fVar169 = auVar70._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar55].ptr;
                    uVar44 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar197 = fVar169 * 1.5 + fVar169 * fVar169 * local_498._0_4_ * -0.5 * fVar169
                      ;
                      fVar198 = (float)local_4a8._0_4_ * fVar197;
                      fVar180 = (float)local_4a8._4_4_ * fVar197;
                      fVar197 = fStack_4a0 * fVar197;
                      fVar169 = fVar244 * fVar198 + fVar230;
                      fVar182 = fVar244 * fVar180 + fVar237;
                      fVar196 = fVar244 * fVar197 + fVar243;
                      fVar170 = fVar180 * fVar230 - fVar237 * fVar198;
                      fVar180 = fVar197 * fVar237 - fVar243 * fVar180;
                      fVar198 = fVar198 * fVar243 - fVar230 * fVar197;
                      fVar197 = fVar182 * fVar180 - fVar198 * fVar169;
                      fVar182 = fVar196 * fVar198 - fVar170 * fVar182;
                      fVar169 = fVar169 * fVar170 - fVar180 * fVar196;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar156;
                        *(float *)(ray + k * 4 + 0xc0) = fVar182;
                        *(float *)(ray + k * 4 + 0xd0) = fVar169;
                        *(float *)(ray + k * 4 + 0xe0) = fVar197;
                        *(float *)(ray + k * 4 + 0xf0) = fVar154;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_5a0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar55;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar56 = context->user->instPrimID[0];
                        uVar44 = (ulong)uVar56;
                        *(uint *)(ray + k * 4 + 0x140) = uVar56;
                      }
                      else {
                        local_378._4_4_ = fVar182;
                        local_378._0_4_ = fVar182;
                        fStack_370 = fVar182;
                        fStack_36c = fVar182;
                        local_368 = fVar169;
                        fStack_364 = fVar169;
                        fStack_360 = fVar169;
                        fStack_35c = fVar169;
                        local_358 = fVar197;
                        fStack_354 = fVar197;
                        fStack_350 = fVar197;
                        fStack_34c = fVar197;
                        local_348 = fVar154;
                        fStack_344 = fVar154;
                        fStack_340 = fVar154;
                        fStack_33c = fVar154;
                        local_338 = 0;
                        uStack_330 = 0;
                        local_328 = CONCAT44(uStack_3b4,local_3b8);
                        uStack_320 = CONCAT44(uStack_3ac,uStack_3b0);
                        local_318 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_310 = CONCAT44(uStack_39c,uStack_3a0);
                        local_308 = context->user->instID[0];
                        uStack_304 = local_308;
                        uStack_300 = local_308;
                        uStack_2fc = local_308;
                        local_2f8 = context->user->instPrimID[0];
                        uStack_2f4 = local_2f8;
                        uStack_2f0 = local_2f8;
                        uStack_2ec = local_2f8;
                        *(float *)(ray + k * 4 + 0x80) = fVar156;
                        local_5b8 = *local_488;
                        _local_598 = (int *)local_5b8;
                        uStack_590 = pGVar8->userPtr;
                        local_588 = context->user;
                        local_580 = ray;
                        local_578 = (RTCHitN *)local_378;
                        local_570 = 4;
                        p_Var46 = pGVar8->intersectionFilterN;
                        if (p_Var46 != (RTCFilterFunctionN)0x0) {
                          p_Var46 = (RTCFilterFunctionN)
                                    (*p_Var46)((RTCFilterFunctionNArguments *)local_598);
                        }
                        auVar133._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                        auVar133._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                        auVar133._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                        auVar133._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                        uVar56 = movmskps((int)p_Var46,auVar133);
                        pRVar45 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                        if ((uVar56 ^ 0xf) == 0) {
                          auVar133 = auVar133 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var46 = context->args->filter;
                          if ((p_Var46 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            p_Var46 = (RTCFilterFunctionN)
                                      (*p_Var46)((RTCFilterFunctionNArguments *)local_598);
                          }
                          auVar96._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                          auVar96._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                          auVar96._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                          auVar96._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                          auVar133 = auVar96 ^ _DAT_01f7ae20;
                          uVar56 = movmskps((int)p_Var46,auVar96);
                          pRVar45 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                          if ((uVar56 ^ 0xf) != 0) {
                            uVar56 = *(uint *)(local_578 + 4);
                            uVar57 = *(uint *)(local_578 + 8);
                            uVar58 = *(uint *)(local_578 + 0xc);
                            *(uint *)(local_580 + 0xc0) =
                                 ~auVar96._0_4_ & *(uint *)local_578 |
                                 *(uint *)(local_580 + 0xc0) & auVar96._0_4_;
                            *(uint *)(local_580 + 0xc4) =
                                 ~auVar96._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xc4) & auVar96._4_4_;
                            *(uint *)(local_580 + 200) =
                                 ~auVar96._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 200) & auVar96._8_4_;
                            *(uint *)(local_580 + 0xcc) =
                                 ~auVar96._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xcc) & auVar96._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x14);
                            uVar57 = *(uint *)(local_578 + 0x18);
                            uVar58 = *(uint *)(local_578 + 0x1c);
                            *(uint *)(local_580 + 0xd0) =
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x10) |
                                 *(uint *)(local_580 + 0xd0) & auVar96._0_4_;
                            *(uint *)(local_580 + 0xd4) =
                                 ~auVar96._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xd4) & auVar96._4_4_;
                            *(uint *)(local_580 + 0xd8) =
                                 ~auVar96._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0xd8) & auVar96._8_4_;
                            *(uint *)(local_580 + 0xdc) =
                                 ~auVar96._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xdc) & auVar96._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x24);
                            uVar57 = *(uint *)(local_578 + 0x28);
                            uVar58 = *(uint *)(local_578 + 0x2c);
                            *(uint *)(local_580 + 0xe0) =
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x20) |
                                 *(uint *)(local_580 + 0xe0) & auVar96._0_4_;
                            *(uint *)(local_580 + 0xe4) =
                                 ~auVar96._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xe4) & auVar96._4_4_;
                            *(uint *)(local_580 + 0xe8) =
                                 ~auVar96._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0xe8) & auVar96._8_4_;
                            *(uint *)(local_580 + 0xec) =
                                 ~auVar96._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xec) & auVar96._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x34);
                            uVar57 = *(uint *)(local_578 + 0x38);
                            uVar58 = *(uint *)(local_578 + 0x3c);
                            *(uint *)(local_580 + 0xf0) =
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x30) |
                                 *(uint *)(local_580 + 0xf0) & auVar96._0_4_;
                            *(uint *)(local_580 + 0xf4) =
                                 ~auVar96._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0xf4) & auVar96._4_4_;
                            *(uint *)(local_580 + 0xf8) =
                                 ~auVar96._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0xf8) & auVar96._8_4_;
                            *(uint *)(local_580 + 0xfc) =
                                 ~auVar96._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0xfc) & auVar96._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x44);
                            uVar57 = *(uint *)(local_578 + 0x48);
                            uVar58 = *(uint *)(local_578 + 0x4c);
                            *(uint *)(local_580 + 0x100) =
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x40) |
                                 *(uint *)(local_580 + 0x100) & auVar96._0_4_;
                            *(uint *)(local_580 + 0x104) =
                                 ~auVar96._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0x104) & auVar96._4_4_;
                            *(uint *)(local_580 + 0x108) =
                                 ~auVar96._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0x108) & auVar96._8_4_;
                            *(uint *)(local_580 + 0x10c) =
                                 ~auVar96._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0x10c) & auVar96._12_4_;
                            uVar56 = *(uint *)(local_578 + 0x54);
                            uVar57 = *(uint *)(local_578 + 0x58);
                            uVar58 = *(uint *)(local_578 + 0x5c);
                            *(uint *)(local_580 + 0x110) =
                                 *(uint *)(local_580 + 0x110) & auVar96._0_4_ |
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x50);
                            *(uint *)(local_580 + 0x114) =
                                 *(uint *)(local_580 + 0x114) & auVar96._4_4_ |
                                 ~auVar96._4_4_ & uVar56;
                            *(uint *)(local_580 + 0x118) =
                                 *(uint *)(local_580 + 0x118) & auVar96._8_4_ |
                                 ~auVar96._8_4_ & uVar57;
                            *(uint *)(local_580 + 0x11c) =
                                 *(uint *)(local_580 + 0x11c) & auVar96._12_4_ |
                                 ~auVar96._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_578 + 100);
                            uVar57 = *(uint *)(local_578 + 0x68);
                            uVar58 = *(uint *)(local_578 + 0x6c);
                            *(uint *)(local_580 + 0x120) =
                                 *(uint *)(local_580 + 0x120) & auVar96._0_4_ |
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x60);
                            *(uint *)(local_580 + 0x124) =
                                 *(uint *)(local_580 + 0x124) & auVar96._4_4_ |
                                 ~auVar96._4_4_ & uVar56;
                            *(uint *)(local_580 + 0x128) =
                                 *(uint *)(local_580 + 0x128) & auVar96._8_4_ |
                                 ~auVar96._8_4_ & uVar57;
                            *(uint *)(local_580 + 300) =
                                 *(uint *)(local_580 + 300) & auVar96._12_4_ |
                                 ~auVar96._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_578 + 0x74);
                            uVar57 = *(uint *)(local_578 + 0x78);
                            uVar58 = *(uint *)(local_578 + 0x7c);
                            *(uint *)(local_580 + 0x130) =
                                 ~auVar96._0_4_ & *(uint *)(local_578 + 0x70) |
                                 *(uint *)(local_580 + 0x130) & auVar96._0_4_;
                            *(uint *)(local_580 + 0x134) =
                                 ~auVar96._4_4_ & uVar56 |
                                 *(uint *)(local_580 + 0x134) & auVar96._4_4_;
                            *(uint *)(local_580 + 0x138) =
                                 ~auVar96._8_4_ & uVar57 |
                                 *(uint *)(local_580 + 0x138) & auVar96._8_4_;
                            *(uint *)(local_580 + 0x13c) =
                                 ~auVar96._12_4_ & uVar58 |
                                 *(uint *)(local_580 + 0x13c) & auVar96._12_4_;
                            *(undefined1 (*) [16])(local_580 + 0x140) =
                                 ~auVar96 & *(undefined1 (*) [16])(local_578 + 0x80) |
                                 *(undefined1 (*) [16])(local_580 + 0x140) & auVar96;
                            pRVar45 = local_580;
                          }
                        }
                        auVar134._0_4_ = auVar133._0_4_ << 0x1f;
                        auVar134._4_4_ = auVar133._4_4_ << 0x1f;
                        auVar134._8_4_ = auVar133._8_4_ << 0x1f;
                        auVar134._12_4_ = auVar133._12_4_ << 0x1f;
                        iVar42 = movmskps((int)pRVar45,auVar134);
                        uVar44 = CONCAT44((int)((ulong)pRVar45 >> 0x20),iVar42);
                        if (iVar42 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar168;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar54 = lVar54 + -1;
              } while (lVar54 != 0);
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              local_3d8._0_4_ = -(uint)(local_548 <= fVar170) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_544 <= fVar170) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_540 <= fVar170) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_53c <= fVar170) & local_3d8._12_4_;
              uVar48 = (undefined4)(uVar44 >> 0x20);
              iVar42 = movmskps((int)uVar44,local_3d8);
            } while (iVar42 != 0);
            iVar42 = 0;
            prim = local_480;
          }
          auVar179._0_4_ =
               local_568._0_4_ & local_3f8._0_4_ &
               -(uint)(local_558 + (float)local_138._0_4_ <= fVar170);
          auVar179._4_4_ =
               local_568._4_4_ & local_3f8._4_4_ &
               -(uint)(fStack_554 + (float)local_138._4_4_ <= fVar170);
          auVar179._8_4_ =
               (uint)fStack_560 & (uint)fStack_3f0 & -(uint)(fStack_550 + fStack_130 <= fVar170);
          auVar179._12_4_ =
               (uint)fStack_55c & (uint)fStack_3ec & -(uint)(fStack_54c + fStack_12c <= fVar170);
          auVar135._4_4_ = -(uint)(fStack_554 + local_2e8._4_4_ <= fVar170);
          auVar135._0_4_ = -(uint)(local_558 + local_2e8._0_4_ <= fVar170);
          auVar135._8_4_ = -(uint)(fStack_550 + local_2e8._8_4_ <= fVar170);
          auVar135._12_4_ = -(uint)(fStack_54c + local_2e8._12_4_ <= fVar170);
          auVar70 = auVar149 & auVar128 & auVar135 | auVar179;
          uVar56 = movmskps(iVar42,auVar70);
          pauVar47 = (undefined1 (*) [16])(ulong)uVar56;
          if (uVar56 != 0) {
            pauVar47 = (undefined1 (*) [16])(uVar52 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar47) = auVar70;
            auStack_e8[uVar52 * 0xc] =
                 ~auVar179._0_4_ & (uint)local_2e8._0_4_ | local_138._0_4_ & auVar179._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar47[-0xf]) =
                 ~auVar179._4_4_ & (uint)local_2e8._4_4_ | local_138._4_4_ & auVar179._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar47[-0xe]) =
                 ~auVar179._8_4_ & (uint)local_2e8._8_4_ | (uint)fStack_130 & auVar179._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar47[-0xe]) =
                 ~auVar179._12_4_ & (uint)local_2e8._12_4_ | (uint)fStack_12c & auVar179._12_4_;
            (&uStack_d8)[uVar52 * 6] = CONCAT44(fStack_1e4,local_1e8);
            aiStack_d0[uVar52 * 0xc] = iVar49 + 1;
            iVar51 = iVar51 + 1;
          }
        }
      }
    }
    if (iVar51 == 0) break;
    fVar99 = *(float *)(ray + k * 4 + 0x80);
    uVar57 = -iVar51;
    pauVar47 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar51 - 1) * 0x30);
    uVar56 = uVar57;
    while( true ) {
      auVar127._0_4_ = -(uint)(local_558 + *(float *)pauVar47[1] <= fVar99) & *(uint *)*pauVar47;
      auVar127._4_4_ =
           -(uint)(fStack_554 + *(float *)(pauVar47[1] + 4) <= fVar99) & *(uint *)(*pauVar47 + 4);
      auVar127._8_4_ =
           -(uint)(fStack_550 + *(float *)(pauVar47[1] + 8) <= fVar99) & *(uint *)(*pauVar47 + 8);
      auVar127._12_4_ =
           -(uint)(fStack_54c + *(float *)(pauVar47[1] + 0xc) <= fVar99) &
           *(uint *)(*pauVar47 + 0xc);
      _local_378 = auVar127;
      iVar49 = movmskps(uVar56,auVar127);
      if (iVar49 != 0) break;
      pauVar47 = pauVar47 + -3;
      uVar57 = uVar57 + 1;
      uVar56 = 0;
      if (uVar57 == 0) goto LAB_00a9e3e3;
    }
    auVar147._0_4_ = (uint)*(float *)pauVar47[1] & auVar127._0_4_;
    auVar147._4_4_ = (uint)*(float *)(pauVar47[1] + 4) & auVar127._4_4_;
    auVar147._8_4_ = (uint)*(float *)(pauVar47[1] + 8) & auVar127._8_4_;
    auVar147._12_4_ = (uint)*(float *)(pauVar47[1] + 0xc) & auVar127._12_4_;
    auVar164._0_8_ = CONCAT44(~auVar127._4_4_,~auVar127._0_4_) & 0x7f8000007f800000;
    auVar164._8_4_ = ~auVar127._8_4_ & 0x7f800000;
    auVar164._12_4_ = ~auVar127._12_4_ & 0x7f800000;
    auVar164 = auVar164 | auVar147;
    auVar148._4_4_ = auVar164._0_4_;
    auVar148._0_4_ = auVar164._4_4_;
    auVar148._8_4_ = auVar164._12_4_;
    auVar148._12_4_ = auVar164._8_4_;
    auVar70 = minps(auVar148,auVar164);
    auVar91._0_8_ = auVar70._8_8_;
    auVar91._8_4_ = auVar70._0_4_;
    auVar91._12_4_ = auVar70._4_4_;
    auVar70 = minps(auVar91,auVar70);
    auVar92._0_8_ =
         CONCAT44(-(uint)(auVar70._4_4_ == auVar164._4_4_) & auVar127._4_4_,
                  -(uint)(auVar70._0_4_ == auVar164._0_4_) & auVar127._0_4_);
    auVar92._8_4_ = -(uint)(auVar70._8_4_ == auVar164._8_4_) & auVar127._8_4_;
    auVar92._12_4_ = -(uint)(auVar70._12_4_ == auVar164._12_4_) & auVar127._12_4_;
    iVar42 = movmskps(iVar49,auVar92);
    if (iVar42 != 0) {
      auVar127._8_4_ = auVar92._8_4_;
      auVar127._0_8_ = auVar92._0_8_;
      auVar127._12_4_ = auVar92._12_4_;
    }
    uVar6 = *(undefined8 *)pauVar47[2];
    iVar49 = *(int *)(pauVar47[2] + 8);
    uVar56 = movmskps(iVar42,auVar127);
    lVar54 = 0;
    if (uVar56 != 0) {
      for (; (uVar56 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
      }
    }
    *(undefined4 *)(local_378 + lVar54 * 4) = 0;
    *pauVar47 = _local_378;
    iVar42 = movmskps((int)pauVar47,_local_378);
    uVar44 = CONCAT44((int)((ulong)pauVar47 >> 0x20),iVar42);
    uVar56 = ~uVar57;
    if (iVar42 != 0) {
      uVar56 = -uVar57;
    }
    uVar52 = (ulong)uVar56;
    fVar99 = (float)uVar6;
    fVar137 = (float)((ulong)uVar6 >> 0x20) - fVar99;
    _local_598 = (int *)CONCAT44(fVar137 * 0.33333334 + fVar99,fVar137 * 0.0 + fVar99);
    uStack_590 = (void *)CONCAT44(fVar137 * 1.0 + fVar99,fVar137 * 0.6666667 + fVar99);
    local_1e8 = *(float *)(local_598 + lVar54 * 4);
    fStack_1e4 = *(float *)(local_598 + lVar54 * 4 + 4);
  } while( true );
LAB_00a9e3e3:
  fVar155 = *(float *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = -(uint)(fStack_2c4 <= fVar155);
  auVar136._0_4_ = -(uint)(local_2c8 <= fVar155);
  auVar136._8_4_ = -(uint)(fStack_2c0 <= fVar155);
  auVar136._12_4_ = -(uint)(fStack_2bc <= fVar155);
  uVar55 = movmskps((int)pauVar47,auVar136);
  uVar55 = (uint)uVar53 & uVar55;
  if (uVar55 == 0) {
    return;
  }
  goto LAB_00a9ba03;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }